

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  bool bVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [12];
  bool bVar76;
  uint uVar77;
  uint uVar78;
  ulong uVar79;
  long lVar80;
  uint uVar81;
  long lVar82;
  ulong uVar83;
  uint uVar85;
  long lVar86;
  bool bVar87;
  vint4 bi_2;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar112;
  float fVar113;
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar102 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar114;
  float fVar141;
  float fVar142;
  vint4 bi_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar143;
  float fVar168;
  float fVar169;
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar170;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar171;
  float fVar196;
  float fVar197;
  vint4 ai_1;
  undefined1 auVar172 [16];
  float fVar199;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar198;
  float fVar200;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar201;
  float fVar202;
  float fVar228;
  float fVar231;
  vint4 ai_2;
  undefined1 auVar203 [16];
  float fVar233;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar229;
  float fVar232;
  float fVar234;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  float fVar230;
  float fVar235;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar236;
  float fVar251;
  float fVar252;
  undefined1 auVar237 [16];
  float fVar253;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar254;
  float fVar266;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar260 [16];
  float fVar267;
  float fVar268;
  undefined1 auVar265 [32];
  vint4 ai;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar302;
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar314;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar315;
  float fVar316;
  undefined1 auVar313 [32];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  float fVar327;
  float fVar335;
  float fVar336;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar337;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar349;
  float fVar350;
  vfloat4 a0;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar351;
  undefined1 auVar348 [16];
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar364 [16];
  undefined1 auVar363 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  float fVar368;
  float fVar369;
  undefined1 auVar367 [32];
  float fVar370;
  float fVar375;
  float fVar376;
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar381 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_6f1;
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  uint local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  uint auStack_470 [4];
  RTCFilterFunctionNArguments local_460;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar84;
  undefined1 auVar195 [32];
  undefined1 auVar380 [32];
  
  PVar9 = prim[1];
  uVar79 = (ulong)(byte)PVar9;
  lVar82 = uVar79 * 0x25;
  auVar129 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar129 = vinsertps_avx(auVar129,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar289 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar289 = vinsertps_avx(auVar289,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar114 = *(float *)(prim + lVar82 + 0x12);
  auVar129 = vsubps_avx(auVar129,*(undefined1 (*) [16])(prim + lVar82 + 6));
  auVar115._0_4_ = fVar114 * auVar129._0_4_;
  auVar115._4_4_ = fVar114 * auVar129._4_4_;
  auVar115._8_4_ = fVar114 * auVar129._8_4_;
  auVar115._12_4_ = fVar114 * auVar129._12_4_;
  auVar269._0_4_ = fVar114 * auVar289._0_4_;
  auVar269._4_4_ = fVar114 * auVar289._4_4_;
  auVar269._8_4_ = fVar114 * auVar289._8_4_;
  auVar269._12_4_ = fVar114 * auVar289._12_4_;
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 6)));
  auVar289 = vcvtdq2ps_avx(auVar289);
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 6)));
  auVar249 = vcvtdq2ps_avx(auVar249);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xf + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar79 + 6)));
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x1a + 6)));
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x1b + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar187 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x1c + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar103 = vshufps_avx(auVar269,auVar269,0);
  auVar157 = vshufps_avx(auVar269,auVar269,0x55);
  auVar18 = vshufps_avx(auVar269,auVar269,0xaa);
  fVar114 = auVar18._0_4_;
  fVar141 = auVar18._4_4_;
  fVar254 = auVar18._8_4_;
  fVar142 = auVar18._12_4_;
  fVar201 = auVar157._0_4_;
  fVar228 = auVar157._4_4_;
  fVar231 = auVar157._8_4_;
  fVar233 = auVar157._12_4_;
  fVar171 = auVar103._0_4_;
  fVar196 = auVar103._4_4_;
  fVar197 = auVar103._8_4_;
  fVar199 = auVar103._12_4_;
  auVar342._0_4_ = fVar171 * auVar129._0_4_ + fVar201 * auVar289._0_4_ + fVar114 * auVar249._0_4_;
  auVar342._4_4_ = fVar196 * auVar129._4_4_ + fVar228 * auVar289._4_4_ + fVar141 * auVar249._4_4_;
  auVar342._8_4_ = fVar197 * auVar129._8_4_ + fVar231 * auVar289._8_4_ + fVar254 * auVar249._8_4_;
  auVar342._12_4_ =
       fVar199 * auVar129._12_4_ + fVar233 * auVar289._12_4_ + fVar142 * auVar249._12_4_;
  auVar359._0_4_ = fVar171 * auVar16._0_4_ + fVar201 * auVar17._0_4_ + auVar208._0_4_ * fVar114;
  auVar359._4_4_ = fVar196 * auVar16._4_4_ + fVar228 * auVar17._4_4_ + auVar208._4_4_ * fVar141;
  auVar359._8_4_ = fVar197 * auVar16._8_4_ + fVar231 * auVar17._8_4_ + auVar208._8_4_ * fVar254;
  auVar359._12_4_ = fVar199 * auVar16._12_4_ + fVar233 * auVar17._12_4_ + auVar208._12_4_ * fVar142;
  auVar270._0_4_ = fVar171 * auVar188._0_4_ + fVar201 * auVar128._0_4_ + auVar187._0_4_ * fVar114;
  auVar270._4_4_ = fVar196 * auVar188._4_4_ + fVar228 * auVar128._4_4_ + auVar187._4_4_ * fVar141;
  auVar270._8_4_ = fVar197 * auVar188._8_4_ + fVar231 * auVar128._8_4_ + auVar187._8_4_ * fVar254;
  auVar270._12_4_ =
       fVar199 * auVar188._12_4_ + fVar233 * auVar128._12_4_ + auVar187._12_4_ * fVar142;
  auVar103 = vshufps_avx(auVar115,auVar115,0);
  auVar157 = vshufps_avx(auVar115,auVar115,0x55);
  auVar18 = vshufps_avx(auVar115,auVar115,0xaa);
  fVar114 = auVar18._0_4_;
  fVar141 = auVar18._4_4_;
  fVar254 = auVar18._8_4_;
  fVar142 = auVar18._12_4_;
  fVar201 = auVar157._0_4_;
  fVar228 = auVar157._4_4_;
  fVar231 = auVar157._8_4_;
  fVar233 = auVar157._12_4_;
  fVar171 = auVar103._0_4_;
  fVar196 = auVar103._4_4_;
  fVar197 = auVar103._8_4_;
  fVar199 = auVar103._12_4_;
  auVar144._0_4_ = fVar171 * auVar129._0_4_ + fVar201 * auVar289._0_4_ + fVar114 * auVar249._0_4_;
  auVar144._4_4_ = fVar196 * auVar129._4_4_ + fVar228 * auVar289._4_4_ + fVar141 * auVar249._4_4_;
  auVar144._8_4_ = fVar197 * auVar129._8_4_ + fVar231 * auVar289._8_4_ + fVar254 * auVar249._8_4_;
  auVar144._12_4_ =
       fVar199 * auVar129._12_4_ + fVar233 * auVar289._12_4_ + fVar142 * auVar249._12_4_;
  auVar116._0_4_ = fVar171 * auVar16._0_4_ + auVar208._0_4_ * fVar114 + fVar201 * auVar17._0_4_;
  auVar116._4_4_ = fVar196 * auVar16._4_4_ + auVar208._4_4_ * fVar141 + fVar228 * auVar17._4_4_;
  auVar116._8_4_ = fVar197 * auVar16._8_4_ + auVar208._8_4_ * fVar254 + fVar231 * auVar17._8_4_;
  auVar116._12_4_ = fVar199 * auVar16._12_4_ + auVar208._12_4_ * fVar142 + fVar233 * auVar17._12_4_;
  auVar88._0_4_ = fVar171 * auVar188._0_4_ + fVar201 * auVar128._0_4_ + auVar187._0_4_ * fVar114;
  auVar88._4_4_ = fVar196 * auVar188._4_4_ + fVar228 * auVar128._4_4_ + auVar187._4_4_ * fVar141;
  auVar88._8_4_ = fVar197 * auVar188._8_4_ + fVar231 * auVar128._8_4_ + auVar187._8_4_ * fVar254;
  auVar88._12_4_ = fVar199 * auVar188._12_4_ + fVar233 * auVar128._12_4_ + auVar187._12_4_ * fVar142
  ;
  auVar255._8_4_ = 0x7fffffff;
  auVar255._0_8_ = 0x7fffffff7fffffff;
  auVar255._12_4_ = 0x7fffffff;
  auVar129 = vandps_avx(auVar342,auVar255);
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  auVar129 = vcmpps_avx(auVar129,auVar203,1);
  auVar289 = vblendvps_avx(auVar342,auVar203,auVar129);
  auVar129 = vandps_avx(auVar359,auVar255);
  auVar129 = vcmpps_avx(auVar129,auVar203,1);
  auVar249 = vblendvps_avx(auVar359,auVar203,auVar129);
  auVar129 = vandps_avx(auVar270,auVar255);
  auVar129 = vcmpps_avx(auVar129,auVar203,1);
  auVar129 = vblendvps_avx(auVar270,auVar203,auVar129);
  auVar16 = vrcpps_avx(auVar289);
  fVar171 = auVar16._0_4_;
  auVar172._0_4_ = fVar171 * auVar289._0_4_;
  fVar196 = auVar16._4_4_;
  auVar172._4_4_ = fVar196 * auVar289._4_4_;
  fVar197 = auVar16._8_4_;
  auVar172._8_4_ = fVar197 * auVar289._8_4_;
  fVar199 = auVar16._12_4_;
  auVar172._12_4_ = fVar199 * auVar289._12_4_;
  auVar271._8_4_ = 0x3f800000;
  auVar271._0_8_ = &DAT_3f8000003f800000;
  auVar271._12_4_ = 0x3f800000;
  auVar289 = vsubps_avx(auVar271,auVar172);
  fVar171 = fVar171 + fVar171 * auVar289._0_4_;
  fVar196 = fVar196 + fVar196 * auVar289._4_4_;
  fVar197 = fVar197 + fVar197 * auVar289._8_4_;
  fVar199 = fVar199 + fVar199 * auVar289._12_4_;
  auVar289 = vrcpps_avx(auVar249);
  fVar201 = auVar289._0_4_;
  auVar237._0_4_ = fVar201 * auVar249._0_4_;
  fVar228 = auVar289._4_4_;
  auVar237._4_4_ = fVar228 * auVar249._4_4_;
  fVar231 = auVar289._8_4_;
  auVar237._8_4_ = fVar231 * auVar249._8_4_;
  fVar233 = auVar289._12_4_;
  auVar237._12_4_ = fVar233 * auVar249._12_4_;
  auVar289 = vsubps_avx(auVar271,auVar237);
  fVar201 = fVar201 + fVar201 * auVar289._0_4_;
  fVar228 = fVar228 + fVar228 * auVar289._4_4_;
  fVar231 = fVar231 + fVar231 * auVar289._8_4_;
  fVar233 = fVar233 + fVar233 * auVar289._12_4_;
  auVar289 = vrcpps_avx(auVar129);
  fVar236 = auVar289._0_4_;
  auVar256._0_4_ = fVar236 * auVar129._0_4_;
  fVar251 = auVar289._4_4_;
  auVar256._4_4_ = fVar251 * auVar129._4_4_;
  fVar252 = auVar289._8_4_;
  auVar256._8_4_ = fVar252 * auVar129._8_4_;
  fVar253 = auVar289._12_4_;
  auVar256._12_4_ = fVar253 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar271,auVar256);
  fVar236 = fVar236 + fVar236 * auVar129._0_4_;
  fVar251 = fVar251 + fVar251 * auVar129._4_4_;
  fVar252 = fVar252 + fVar252 * auVar129._8_4_;
  fVar253 = fVar253 + fVar253 * auVar129._12_4_;
  auVar129 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar82 + 0x16)) *
                           *(float *)(prim + lVar82 + 0x1a)));
  auVar249 = vshufps_avx(auVar129,auVar129,0);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar79 * 7 + 6);
  auVar129 = vpmovsxwd_avx(auVar129);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar289 = vpmovsxwd_avx(auVar289);
  auVar289 = vcvtdq2ps_avx(auVar289);
  auVar289 = vsubps_avx(auVar289,auVar129);
  fVar114 = auVar249._0_4_;
  fVar141 = auVar249._4_4_;
  fVar254 = auVar249._8_4_;
  fVar142 = auVar249._12_4_;
  auVar272._0_4_ = auVar289._0_4_ * fVar114 + auVar129._0_4_;
  auVar272._4_4_ = auVar289._4_4_ * fVar141 + auVar129._4_4_;
  auVar272._8_4_ = auVar289._8_4_ * fVar254 + auVar129._8_4_;
  auVar272._12_4_ = auVar289._12_4_ * fVar142 + auVar129._12_4_;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *(ulong *)(prim + uVar79 * 9 + 6);
  auVar129 = vpmovsxwd_avx(auVar249);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar79 * 0xd + 6);
  auVar289 = vpmovsxwd_avx(auVar16);
  auVar289 = vcvtdq2ps_avx(auVar289);
  auVar289 = vsubps_avx(auVar289,auVar129);
  auVar282._0_4_ = auVar289._0_4_ * fVar114 + auVar129._0_4_;
  auVar282._4_4_ = auVar289._4_4_ * fVar141 + auVar129._4_4_;
  auVar282._8_4_ = auVar289._8_4_ * fVar254 + auVar129._8_4_;
  auVar282._12_4_ = auVar289._12_4_ * fVar142 + auVar129._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar79 * 0x12 + 6);
  auVar129 = vpmovsxwd_avx(auVar17);
  auVar129 = vcvtdq2ps_avx(auVar129);
  uVar83 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + uVar79 * 2 + uVar83 + 6);
  auVar289 = vpmovsxwd_avx(auVar208);
  auVar289 = vcvtdq2ps_avx(auVar289);
  auVar289 = vsubps_avx(auVar289,auVar129);
  auVar303._0_4_ = auVar289._0_4_ * fVar114 + auVar129._0_4_;
  auVar303._4_4_ = auVar289._4_4_ * fVar141 + auVar129._4_4_;
  auVar303._8_4_ = auVar289._8_4_ * fVar254 + auVar129._8_4_;
  auVar303._12_4_ = auVar289._12_4_ * fVar142 + auVar129._12_4_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar129 = vpmovsxwd_avx(auVar188);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar79 * 0x18 + 6);
  auVar289 = vpmovsxwd_avx(auVar128);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar289 = vcvtdq2ps_avx(auVar289);
  auVar289 = vsubps_avx(auVar289,auVar129);
  auVar317._0_4_ = auVar289._0_4_ * fVar114 + auVar129._0_4_;
  auVar317._4_4_ = auVar289._4_4_ * fVar141 + auVar129._4_4_;
  auVar317._8_4_ = auVar289._8_4_ * fVar254 + auVar129._8_4_;
  auVar317._12_4_ = auVar289._12_4_ * fVar142 + auVar129._12_4_;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar79 * 0x1d + 6);
  auVar129 = vpmovsxwd_avx(auVar187);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar79 + (ulong)(byte)PVar9 * 0x20 + 6);
  auVar289 = vpmovsxwd_avx(auVar103);
  auVar289 = vcvtdq2ps_avx(auVar289);
  auVar249 = vsubps_avx(auVar289,auVar129);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar9 * 0x20 - uVar79) + 6);
  auVar289 = vpmovsxwd_avx(auVar157);
  auVar328._0_4_ = auVar249._0_4_ * fVar114 + auVar129._0_4_;
  auVar328._4_4_ = auVar249._4_4_ * fVar141 + auVar129._4_4_;
  auVar328._8_4_ = auVar249._8_4_ * fVar254 + auVar129._8_4_;
  auVar328._12_4_ = auVar249._12_4_ * fVar142 + auVar129._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar79 * 0x23 + 6);
  auVar249 = vpmovsxwd_avx(auVar18);
  auVar129 = vcvtdq2ps_avx(auVar289);
  auVar289 = vcvtdq2ps_avx(auVar249);
  auVar289 = vsubps_avx(auVar289,auVar129);
  auVar257._0_4_ = auVar129._0_4_ + auVar289._0_4_ * fVar114;
  auVar257._4_4_ = auVar129._4_4_ + auVar289._4_4_ * fVar141;
  auVar257._8_4_ = auVar129._8_4_ + auVar289._8_4_ * fVar254;
  auVar257._12_4_ = auVar129._12_4_ + auVar289._12_4_ * fVar142;
  auVar129 = vsubps_avx(auVar272,auVar144);
  auVar273._0_4_ = fVar171 * auVar129._0_4_;
  auVar273._4_4_ = fVar196 * auVar129._4_4_;
  auVar273._8_4_ = fVar197 * auVar129._8_4_;
  auVar273._12_4_ = fVar199 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar282,auVar144);
  auVar145._0_4_ = fVar171 * auVar129._0_4_;
  auVar145._4_4_ = fVar196 * auVar129._4_4_;
  auVar145._8_4_ = fVar197 * auVar129._8_4_;
  auVar145._12_4_ = fVar199 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar303,auVar116);
  auVar173._0_4_ = fVar201 * auVar129._0_4_;
  auVar173._4_4_ = fVar228 * auVar129._4_4_;
  auVar173._8_4_ = fVar231 * auVar129._8_4_;
  auVar173._12_4_ = fVar233 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar317,auVar116);
  auVar117._0_4_ = fVar201 * auVar129._0_4_;
  auVar117._4_4_ = fVar228 * auVar129._4_4_;
  auVar117._8_4_ = fVar231 * auVar129._8_4_;
  auVar117._12_4_ = fVar233 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar328,auVar88);
  auVar204._0_4_ = fVar236 * auVar129._0_4_;
  auVar204._4_4_ = fVar251 * auVar129._4_4_;
  auVar204._8_4_ = fVar252 * auVar129._8_4_;
  auVar204._12_4_ = fVar253 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar257,auVar88);
  auVar89._0_4_ = fVar236 * auVar129._0_4_;
  auVar89._4_4_ = fVar251 * auVar129._4_4_;
  auVar89._8_4_ = fVar252 * auVar129._8_4_;
  auVar89._12_4_ = fVar253 * auVar129._12_4_;
  auVar129 = vpminsd_avx(auVar273,auVar145);
  auVar289 = vpminsd_avx(auVar173,auVar117);
  auVar129 = vmaxps_avx(auVar129,auVar289);
  auVar289 = vpminsd_avx(auVar204,auVar89);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar283._4_4_ = uVar6;
  auVar283._0_4_ = uVar6;
  auVar283._8_4_ = uVar6;
  auVar283._12_4_ = uVar6;
  auVar289 = vmaxps_avx(auVar289,auVar283);
  auVar129 = vmaxps_avx(auVar129,auVar289);
  local_3f0._0_4_ = auVar129._0_4_ * 0.99999964;
  local_3f0._4_4_ = auVar129._4_4_ * 0.99999964;
  local_3f0._8_4_ = auVar129._8_4_ * 0.99999964;
  local_3f0._12_4_ = auVar129._12_4_ * 0.99999964;
  auVar129 = vpmaxsd_avx(auVar273,auVar145);
  auVar289 = vpmaxsd_avx(auVar173,auVar117);
  auVar129 = vminps_avx(auVar129,auVar289);
  auVar289 = vpmaxsd_avx(auVar204,auVar89);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar146._4_4_ = uVar6;
  auVar146._0_4_ = uVar6;
  auVar146._8_4_ = uVar6;
  auVar146._12_4_ = uVar6;
  auVar289 = vminps_avx(auVar289,auVar146);
  auVar129 = vminps_avx(auVar129,auVar289);
  auVar90._0_4_ = auVar129._0_4_ * 1.0000004;
  auVar90._4_4_ = auVar129._4_4_ * 1.0000004;
  auVar90._8_4_ = auVar129._8_4_ * 1.0000004;
  auVar90._12_4_ = auVar129._12_4_ * 1.0000004;
  auVar129 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar289 = vpcmpgtd_avx(auVar129,_DAT_01ff0cf0);
  auVar129 = vcmpps_avx(local_3f0,auVar90,2);
  auVar129 = vandps_avx(auVar129,auVar289);
  uVar77 = vmovmskps_avx(auVar129);
  local_6f1 = uVar77 != 0;
  if (uVar77 == 0) {
    return local_6f1;
  }
  uVar77 = uVar77 & 0xff;
  auVar106._16_16_ = mm_lookupmask_ps._240_16_;
  auVar106._0_16_ = mm_lookupmask_ps._240_16_;
  local_320 = vblendps_avx(auVar106,ZEXT832(0) << 0x20,0x80);
  uVar85 = 1 << ((byte)k & 0x1f);
  uVar79 = (ulong)((uVar85 & 0xf) << 4);
  lVar82 = (long)((int)uVar85 >> 4) * 0x10;
  auVar381 = ZEXT464(0) << 0x20;
LAB_010342ce:
  lVar80 = 0;
  if (uVar77 != 0) {
    for (; (uVar77 >> lVar80 & 1) == 0; lVar80 = lVar80 + 1) {
    }
  }
  uVar85 = *(uint *)(prim + 2);
  pGVar10 = (context->scene->geometries).items[uVar85].ptr;
  fVar114 = (pGVar10->time_range).lower;
  fVar254 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar114) / ((pGVar10->time_range).upper - fVar114));
  auVar129 = vroundss_avx(ZEXT416((uint)fVar254),ZEXT416((uint)fVar254),9);
  auVar129 = vminss_avx(auVar129,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar129 = vmaxss_avx(ZEXT816(0) << 0x20,auVar129);
  uVar83 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           (ulong)*(uint *)(prim + lVar80 * 4 + 6) *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar86 = (long)(int)auVar129._0_4_ * 0x38;
  lVar12 = *(long *)(_Var11 + lVar86);
  lVar13 = *(long *)(_Var11 + 0x10 + lVar86);
  pfVar4 = (float *)(lVar12 + lVar13 * uVar83);
  fVar142 = *pfVar4;
  fVar171 = pfVar4[1];
  fVar196 = pfVar4[2];
  fVar197 = pfVar4[3];
  lVar1 = uVar83 + 1;
  pfVar4 = (float *)(lVar12 + lVar13 * lVar1);
  fVar199 = *pfVar4;
  fVar201 = pfVar4[1];
  fVar228 = pfVar4[2];
  fVar231 = pfVar4[3];
  lVar2 = uVar83 + 2;
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar233 = *pfVar4;
  fVar236 = pfVar4[1];
  fVar251 = pfVar4[2];
  fVar252 = pfVar4[3];
  lVar3 = uVar83 + 3;
  pfVar4 = (float *)(lVar12 + lVar13 * lVar3);
  fVar253 = *pfVar4;
  fVar198 = pfVar4[1];
  fVar200 = pfVar4[2];
  fVar202 = pfVar4[3];
  lVar12 = *(long *)&pGVar10[4].fnumTimeSegments;
  lVar13 = *(long *)(lVar12 + lVar86);
  lVar14 = *(long *)(lVar12 + 0x10 + lVar86);
  auVar289 = *(undefined1 (*) [16])(lVar13 + lVar14 * uVar83);
  pfVar4 = (float *)(lVar13 + lVar14 * lVar1);
  fVar229 = *pfVar4;
  fVar232 = pfVar4[1];
  fVar234 = pfVar4[2];
  fVar112 = pfVar4[3];
  pfVar4 = (float *)(lVar13 + lVar14 * lVar2);
  fVar113 = *pfVar4;
  fVar314 = pfVar4[1];
  fVar170 = pfVar4[2];
  fVar315 = pfVar4[3];
  fVar254 = fVar254 - auVar129._0_4_;
  pfVar4 = (float *)(lVar13 + lVar14 * lVar3);
  fVar316 = *pfVar4;
  fVar327 = pfVar4[1];
  fVar302 = pfVar4[2];
  fVar143 = pfVar4[3];
  fVar114 = auVar381._8_4_;
  fVar141 = auVar381._12_4_;
  local_6b0._0_4_ =
       fVar142 * 0.16666667 + fVar199 * 0.6666667 + fVar233 * 0.16666667 + fVar253 * 0.0;
  local_6b0._4_4_ =
       fVar171 * 0.16666667 + fVar201 * 0.6666667 + fVar236 * 0.16666667 + fVar198 * 0.0;
  fStack_6a8 = fVar196 * 0.16666667 + fVar228 * 0.6666667 + fVar251 * 0.16666667 + fVar200 * fVar114
  ;
  fStack_6a4 = fVar197 * 0.16666667 + fVar231 * 0.6666667 + fVar252 * 0.16666667 + fVar202 * fVar141
  ;
  auVar91._0_4_ = fVar233 * 0.5 + fVar253 * 0.0;
  auVar91._4_4_ = fVar236 * 0.5 + fVar198 * 0.0;
  auVar91._8_4_ = fVar251 * 0.5 + fVar200 * fVar114;
  auVar91._12_4_ = fVar252 * 0.5 + fVar202 * fVar141;
  auVar147._0_4_ = fVar199 * 0.0;
  auVar147._4_4_ = fVar201 * 0.0;
  auVar147._8_4_ = fVar114 * fVar228;
  auVar147._12_4_ = fVar141 * fVar231;
  auVar129 = vsubps_avx(auVar91,auVar147);
  auVar148._0_4_ = fVar142 * 0.5;
  auVar148._4_4_ = fVar171 * 0.5;
  auVar148._8_4_ = fVar196 * 0.5;
  auVar148._12_4_ = fVar197 * 0.5;
  auVar188 = vsubps_avx(auVar129,auVar148);
  local_640._0_4_ = auVar289._0_4_;
  local_640._4_4_ = auVar289._4_4_;
  fStack_638 = auVar289._8_4_;
  fStack_634 = auVar289._12_4_;
  auVar92._0_4_ =
       (float)local_640._0_4_ * 0.16666667 +
       fVar229 * 0.6666667 + fVar113 * 0.16666667 + fVar316 * 0.0;
  auVar92._4_4_ =
       (float)local_640._4_4_ * 0.16666667 +
       fVar232 * 0.6666667 + fVar314 * 0.16666667 + fVar327 * 0.0;
  auVar92._8_4_ =
       fStack_638 * 0.16666667 + fVar234 * 0.6666667 + fVar170 * 0.16666667 + fVar302 * fVar114;
  auVar92._12_4_ =
       fStack_634 * 0.16666667 + fVar112 * 0.6666667 + fVar315 * 0.16666667 + fVar143 * fVar141;
  auVar258._0_4_ = fVar113 * 0.5 + fVar316 * 0.0;
  auVar258._4_4_ = fVar314 * 0.5 + fVar327 * 0.0;
  auVar258._8_4_ = fVar170 * 0.5 + fVar302 * fVar114;
  auVar258._12_4_ = fVar315 * 0.5 + fVar143 * fVar141;
  auVar343._0_4_ = fVar229 * 0.0;
  auVar343._4_4_ = fVar232 * 0.0;
  auVar343._8_4_ = fVar114 * fVar234;
  auVar343._12_4_ = fVar141 * fVar112;
  auVar129 = vsubps_avx(auVar258,auVar343);
  auVar344._0_4_ = (float)local_640._0_4_ * 0.5;
  auVar344._4_4_ = (float)local_640._4_4_ * 0.5;
  auVar344._8_4_ = fStack_638 * 0.5;
  auVar344._12_4_ = fStack_634 * 0.5;
  auVar16 = vsubps_avx(auVar129,auVar344);
  auVar205._0_4_ = fVar142 * 0.0;
  auVar205._4_4_ = fVar171 * 0.0;
  auVar205._8_4_ = fVar114 * fVar196;
  auVar205._12_4_ = fVar141 * fVar197;
  auVar259._0_4_ =
       auVar205._0_4_ + fVar199 * 0.16666667 + fVar233 * 0.6666667 + fVar253 * 0.16666667;
  auVar259._4_4_ =
       auVar205._4_4_ + fVar201 * 0.16666667 + fVar236 * 0.6666667 + fVar198 * 0.16666667;
  auVar259._8_4_ =
       auVar205._8_4_ + fVar228 * 0.16666667 + fVar251 * 0.6666667 + fVar200 * 0.16666667;
  auVar259._12_4_ =
       auVar205._12_4_ + fVar231 * 0.16666667 + fVar252 * 0.6666667 + fVar202 * 0.16666667;
  auVar274._0_4_ = fVar253 * 0.5 + fVar233 * 0.0;
  auVar274._4_4_ = fVar198 * 0.5 + fVar236 * 0.0;
  auVar274._8_4_ = fVar200 * 0.5 + fVar114 * fVar251;
  auVar274._12_4_ = fVar202 * 0.5 + fVar141 * fVar252;
  auVar174._0_4_ = fVar199 * 0.5;
  auVar174._4_4_ = fVar201 * 0.5;
  auVar174._8_4_ = fVar228 * 0.5;
  auVar174._12_4_ = fVar231 * 0.5;
  auVar129 = vsubps_avx(auVar274,auVar174);
  auVar128 = vsubps_avx(auVar129,auVar205);
  auVar206._0_4_ = (float)local_640._0_4_ * 0.0;
  auVar206._4_4_ = (float)local_640._4_4_ * 0.0;
  auVar206._8_4_ = fVar114 * fStack_638;
  auVar206._12_4_ = fVar141 * fStack_634;
  auVar175._0_4_ =
       auVar206._0_4_ + fVar229 * 0.16666667 + fVar113 * 0.6666667 + fVar316 * 0.16666667;
  auVar175._4_4_ =
       auVar206._4_4_ + fVar232 * 0.16666667 + fVar314 * 0.6666667 + fVar327 * 0.16666667;
  auVar175._8_4_ =
       auVar206._8_4_ + fVar234 * 0.16666667 + fVar170 * 0.6666667 + fVar302 * 0.16666667;
  auVar175._12_4_ =
       auVar206._12_4_ + fVar112 * 0.16666667 + fVar315 * 0.6666667 + fVar143 * 0.16666667;
  auVar275._0_4_ = fVar113 * 0.0 + fVar316 * 0.5;
  auVar275._4_4_ = fVar314 * 0.0 + fVar327 * 0.5;
  auVar275._8_4_ = fVar170 * fVar114 + fVar302 * 0.5;
  auVar275._12_4_ = fVar315 * fVar141 + fVar143 * 0.5;
  auVar238._0_4_ = fVar229 * 0.5;
  auVar238._4_4_ = fVar232 * 0.5;
  auVar238._8_4_ = fVar234 * 0.5;
  auVar238._12_4_ = fVar112 * 0.5;
  auVar129 = vsubps_avx(auVar275,auVar238);
  auVar208 = vsubps_avx(auVar129,auVar206);
  auVar129 = vshufps_avx(auVar188,auVar188,0xc9);
  auVar289 = vshufps_avx(auVar92,auVar92,0xc9);
  fVar143 = auVar188._0_4_;
  auVar276._0_4_ = fVar143 * auVar289._0_4_;
  fVar168 = auVar188._4_4_;
  auVar276._4_4_ = fVar168 * auVar289._4_4_;
  fVar169 = auVar188._8_4_;
  auVar276._8_4_ = fVar169 * auVar289._8_4_;
  fVar335 = auVar188._12_4_;
  auVar276._12_4_ = fVar335 * auVar289._12_4_;
  auVar93._0_4_ = auVar129._0_4_ * auVar92._0_4_;
  auVar93._4_4_ = auVar129._4_4_ * auVar92._4_4_;
  auVar93._8_4_ = auVar129._8_4_ * auVar92._8_4_;
  auVar93._12_4_ = auVar129._12_4_ * auVar92._12_4_;
  auVar289 = vsubps_avx(auVar93,auVar276);
  auVar249 = vshufps_avx(auVar289,auVar289,0xc9);
  auVar289 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar277._0_4_ = fVar143 * auVar289._0_4_;
  auVar277._4_4_ = fVar168 * auVar289._4_4_;
  auVar277._8_4_ = fVar169 * auVar289._8_4_;
  auVar277._12_4_ = fVar335 * auVar289._12_4_;
  auVar239._0_4_ = auVar16._0_4_ * auVar129._0_4_;
  auVar239._4_4_ = auVar16._4_4_ * auVar129._4_4_;
  auVar239._8_4_ = auVar16._8_4_ * auVar129._8_4_;
  auVar239._12_4_ = auVar16._12_4_ * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar239,auVar277);
  auVar16 = vshufps_avx(auVar129,auVar129,0xc9);
  auVar129 = vshufps_avx(auVar128,auVar128,0xc9);
  auVar289 = vshufps_avx(auVar175,auVar175,0xc9);
  fVar230 = auVar128._0_4_;
  auVar284._0_4_ = fVar230 * auVar289._0_4_;
  fVar336 = auVar128._4_4_;
  auVar284._4_4_ = fVar336 * auVar289._4_4_;
  fVar235 = auVar128._8_4_;
  auVar284._8_4_ = fVar235 * auVar289._8_4_;
  fVar337 = auVar128._12_4_;
  auVar284._12_4_ = fVar337 * auVar289._12_4_;
  auVar176._0_4_ = auVar129._0_4_ * auVar175._0_4_;
  auVar176._4_4_ = auVar129._4_4_ * auVar175._4_4_;
  auVar176._8_4_ = auVar129._8_4_ * auVar175._8_4_;
  auVar176._12_4_ = auVar129._12_4_ * auVar175._12_4_;
  auVar289 = vsubps_avx(auVar176,auVar284);
  auVar17 = vshufps_avx(auVar289,auVar289,0xc9);
  auVar289 = vshufps_avx(auVar208,auVar208,0xc9);
  auVar285._0_4_ = fVar230 * auVar289._0_4_;
  auVar285._4_4_ = fVar336 * auVar289._4_4_;
  auVar285._8_4_ = fVar235 * auVar289._8_4_;
  auVar285._12_4_ = fVar337 * auVar289._12_4_;
  auVar207._0_4_ = auVar129._0_4_ * auVar208._0_4_;
  auVar207._4_4_ = auVar129._4_4_ * auVar208._4_4_;
  auVar207._8_4_ = auVar129._8_4_ * auVar208._8_4_;
  auVar207._12_4_ = auVar129._12_4_ * auVar208._12_4_;
  auVar187 = vsubps_avx(auVar207,auVar285);
  auVar129 = vdpps_avx(auVar249,auVar249,0x7f);
  fVar141 = auVar129._0_4_;
  auVar318._4_12_ = auVar381._4_12_;
  auVar318._0_4_ = fVar141;
  auVar289 = vrsqrtss_avx(auVar318,auVar318);
  fVar114 = auVar289._0_4_;
  auVar289 = vdpps_avx(auVar249,auVar16,0x7f);
  auVar208 = ZEXT416((uint)(fVar114 * 1.5 - fVar141 * 0.5 * fVar114 * fVar114 * fVar114));
  auVar208 = vshufps_avx(auVar208,auVar208,0);
  fVar202 = auVar208._0_4_ * auVar249._0_4_;
  fVar229 = auVar208._4_4_ * auVar249._4_4_;
  fVar232 = auVar208._8_4_ * auVar249._8_4_;
  fVar234 = auVar208._12_4_ * auVar249._12_4_;
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar278._0_4_ = auVar129._0_4_ * auVar16._0_4_;
  auVar278._4_4_ = auVar129._4_4_ * auVar16._4_4_;
  auVar278._8_4_ = auVar129._8_4_ * auVar16._8_4_;
  auVar278._12_4_ = auVar129._12_4_ * auVar16._12_4_;
  auVar129 = vshufps_avx(auVar289,auVar289,0);
  auVar94._0_4_ = auVar129._0_4_ * auVar249._0_4_;
  auVar94._4_4_ = auVar129._4_4_ * auVar249._4_4_;
  auVar94._8_4_ = auVar129._8_4_ * auVar249._8_4_;
  auVar94._12_4_ = auVar129._12_4_ * auVar249._12_4_;
  auVar103 = vsubps_avx(auVar278,auVar94);
  auVar129 = vrcpss_avx(auVar318,auVar318);
  auVar129 = ZEXT416((uint)((2.0 - fVar141 * auVar129._0_4_) * auVar129._0_4_));
  auVar249 = vshufps_avx(auVar129,auVar129,0);
  auVar129 = vdpps_avx(auVar17,auVar17,0x7f);
  fVar112 = auVar129._0_4_;
  auVar319._4_12_ = auVar381._4_12_;
  auVar319._0_4_ = fVar112;
  auVar289 = vrsqrtss_avx(auVar319,auVar319);
  fVar252 = auVar289._0_4_;
  lVar13 = *(long *)(_Var11 + 0x38 + lVar86);
  lVar14 = *(long *)(_Var11 + 0x48 + lVar86);
  pauVar5 = (undefined1 (*) [12])(lVar13 + lVar14 * uVar83);
  auVar75 = *pauVar5;
  fVar114 = *(float *)pauVar5[1];
  pfVar4 = (float *)(lVar13 + lVar14 * lVar1);
  fVar141 = *pfVar4;
  fVar142 = pfVar4[1];
  fVar171 = pfVar4[2];
  fVar196 = pfVar4[3];
  pfVar4 = (float *)(lVar13 + lVar14 * lVar2);
  fVar197 = *pfVar4;
  fVar199 = pfVar4[1];
  fVar201 = pfVar4[2];
  fVar228 = pfVar4[3];
  auVar289 = vshufps_avx(auVar187,auVar187,0xc9);
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar371._0_4_ = auVar129._0_4_ * auVar289._0_4_;
  auVar371._4_4_ = auVar129._4_4_ * auVar289._4_4_;
  auVar371._8_4_ = auVar129._8_4_ * auVar289._8_4_;
  auVar371._12_4_ = auVar129._12_4_ * auVar289._12_4_;
  auVar129 = vdpps_avx(auVar17,auVar289,0x7f);
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar95._0_4_ = auVar129._0_4_ * auVar17._0_4_;
  auVar95._4_4_ = auVar129._4_4_ * auVar17._4_4_;
  auVar95._8_4_ = auVar129._8_4_ * auVar17._8_4_;
  auVar95._12_4_ = auVar129._12_4_ * auVar17._12_4_;
  auVar187 = vsubps_avx(auVar371,auVar95);
  pfVar4 = (float *)(lVar13 + lVar14 * lVar3);
  fVar231 = *pfVar4;
  fVar233 = pfVar4[1];
  fVar236 = pfVar4[2];
  fVar251 = pfVar4[3];
  lVar13 = *(long *)(lVar12 + 0x38 + lVar86);
  lVar12 = *(long *)(lVar12 + 0x48 + lVar86);
  auVar129 = ZEXT416((uint)(fVar252 * 1.5 - fVar252 * fVar252 * fVar252 * fVar112 * 0.5));
  auVar289 = vshufps_avx(auVar129,auVar129,0);
  fVar252 = auVar17._0_4_ * auVar289._0_4_;
  fVar253 = auVar17._4_4_ * auVar289._4_4_;
  fVar198 = auVar17._8_4_ * auVar289._8_4_;
  fVar200 = auVar17._12_4_ * auVar289._12_4_;
  auVar129 = vrcpss_avx(auVar319,auVar319);
  auVar129 = ZEXT416((uint)(auVar129._0_4_ * (2.0 - fVar112 * auVar129._0_4_)));
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar16 = vshufps_avx(_local_6b0,_local_6b0,0xff);
  auVar320._0_4_ = auVar16._0_4_ * fVar202;
  auVar320._4_4_ = auVar16._4_4_ * fVar229;
  auVar320._8_4_ = auVar16._8_4_ * fVar232;
  auVar320._12_4_ = auVar16._12_4_ * fVar234;
  auVar17 = vshufps_avx(auVar188,auVar188,0xff);
  auVar157 = vsubps_avx(_local_6b0,auVar320);
  auVar209._0_4_ =
       auVar17._0_4_ * fVar202 + auVar16._0_4_ * auVar208._0_4_ * auVar103._0_4_ * auVar249._0_4_;
  auVar209._4_4_ =
       auVar17._4_4_ * fVar229 + auVar16._4_4_ * auVar208._4_4_ * auVar103._4_4_ * auVar249._4_4_;
  auVar209._8_4_ =
       auVar17._8_4_ * fVar232 + auVar16._8_4_ * auVar208._8_4_ * auVar103._8_4_ * auVar249._8_4_;
  auVar209._12_4_ =
       auVar17._12_4_ * fVar234 +
       auVar16._12_4_ * auVar208._12_4_ * auVar103._12_4_ * auVar249._12_4_;
  auVar188 = vsubps_avx(auVar188,auVar209);
  local_6b0._0_4_ = (float)local_6b0._0_4_ + auVar320._0_4_;
  local_6b0._4_4_ = (float)local_6b0._4_4_ + auVar320._4_4_;
  fStack_6a8 = fStack_6a8 + auVar320._8_4_;
  fStack_6a4 = fStack_6a4 + auVar320._12_4_;
  auVar249 = vshufps_avx(auVar259,auVar259,0xff);
  auVar149._0_4_ = auVar249._0_4_ * fVar252;
  auVar149._4_4_ = auVar249._4_4_ * fVar253;
  auVar149._8_4_ = auVar249._8_4_ * fVar198;
  auVar149._12_4_ = auVar249._12_4_ * fVar200;
  auVar16 = vshufps_avx(auVar128,auVar128,0xff);
  auVar103 = vsubps_avx(auVar259,auVar149);
  auVar96._0_4_ =
       auVar16._0_4_ * fVar252 + auVar249._0_4_ * auVar289._0_4_ * auVar129._0_4_ * auVar187._0_4_;
  auVar96._4_4_ =
       auVar16._4_4_ * fVar253 + auVar249._4_4_ * auVar289._4_4_ * auVar129._4_4_ * auVar187._4_4_;
  auVar96._8_4_ =
       auVar16._8_4_ * fVar198 + auVar249._8_4_ * auVar289._8_4_ * auVar129._8_4_ * auVar187._8_4_;
  auVar96._12_4_ =
       auVar16._12_4_ * fVar200 +
       auVar249._12_4_ * auVar289._12_4_ * auVar129._12_4_ * auVar187._12_4_;
  auVar128 = vsubps_avx(auVar128,auVar96);
  local_640._4_4_ = auVar259._4_4_ + auVar149._4_4_;
  local_640._0_4_ = auVar259._0_4_ + auVar149._0_4_;
  fStack_638 = auVar259._8_4_ + auVar149._8_4_;
  fStack_634 = auVar259._12_4_ + auVar149._12_4_;
  local_680._0_4_ =
       *(float *)*pauVar5 * 0.16666667 + fVar141 * 0.6666667 + fVar197 * 0.16666667 + fVar231 * 0.0;
  local_680._4_4_ =
       *(float *)(*pauVar5 + 4) * 0.16666667 +
       fVar142 * 0.6666667 + fVar199 * 0.16666667 + fVar233 * 0.0;
  fStack_678 = *(float *)(*pauVar5 + 8) * 0.16666667 +
               fVar171 * 0.6666667 + fVar201 * 0.16666667 + fVar236 * 0.0;
  fStack_674 = fVar114 * 0.16666667 + fVar196 * 0.6666667 + fVar228 * 0.16666667 + fVar251 * 0.0;
  auVar97._0_4_ = fVar197 * 0.5 + fVar231 * 0.0;
  auVar97._4_4_ = fVar199 * 0.5 + fVar233 * 0.0;
  auVar97._8_4_ = fVar201 * 0.5 + fVar236 * 0.0;
  auVar97._12_4_ = fVar228 * 0.5 + fVar251 * 0.0;
  auVar118._0_4_ = fVar141 * 0.0;
  auVar118._4_4_ = fVar142 * 0.0;
  auVar118._8_4_ = fVar171 * 0.0;
  auVar118._12_4_ = fVar196 * 0.0;
  auVar129 = vsubps_avx(auVar97,auVar118);
  auVar119._0_4_ = *(float *)*pauVar5 * 0.5;
  auVar119._4_4_ = *(float *)(*pauVar5 + 4) * 0.5;
  auVar119._8_4_ = *(float *)(*pauVar5 + 8) * 0.5;
  auVar119._12_4_ = fVar114 * 0.5;
  auVar187 = vsubps_avx(auVar129,auVar119);
  pfVar4 = (float *)(lVar13 + lVar2 * lVar12);
  fVar252 = *pfVar4;
  fVar253 = pfVar4[1];
  fVar198 = pfVar4[2];
  fVar200 = pfVar4[3];
  pfVar4 = (float *)(lVar13 + lVar12 * lVar3);
  fVar202 = *pfVar4;
  fVar229 = pfVar4[1];
  fVar232 = pfVar4[2];
  fVar234 = pfVar4[3];
  pfVar4 = (float *)(lVar13 + lVar1 * lVar12);
  fVar112 = *pfVar4;
  fVar113 = pfVar4[1];
  fVar314 = pfVar4[2];
  fVar170 = pfVar4[3];
  pfVar4 = (float *)(lVar13 + uVar83 * lVar12);
  fVar315 = *pfVar4;
  fVar316 = pfVar4[1];
  fVar327 = pfVar4[2];
  fVar302 = pfVar4[3];
  auVar210._0_4_ = fVar315 * 0.16666667 + fVar112 * 0.6666667 + fVar252 * 0.16666667 + fVar202 * 0.0
  ;
  auVar210._4_4_ = fVar316 * 0.16666667 + fVar113 * 0.6666667 + fVar253 * 0.16666667 + fVar229 * 0.0
  ;
  auVar210._8_4_ = fVar327 * 0.16666667 + fVar314 * 0.6666667 + fVar198 * 0.16666667 + fVar232 * 0.0
  ;
  auVar210._12_4_ =
       fVar302 * 0.16666667 + fVar170 * 0.6666667 + fVar200 * 0.16666667 + fVar234 * 0.0;
  auVar177._0_4_ = fVar252 * 0.5 + fVar202 * 0.0;
  auVar177._4_4_ = fVar253 * 0.5 + fVar229 * 0.0;
  auVar177._8_4_ = fVar198 * 0.5 + fVar232 * 0.0;
  auVar177._12_4_ = fVar200 * 0.5 + fVar234 * 0.0;
  auVar286._0_4_ = fVar112 * 0.0;
  auVar286._4_4_ = fVar113 * 0.0;
  auVar286._8_4_ = fVar314 * 0.0;
  auVar286._12_4_ = fVar170 * 0.0;
  auVar129 = vsubps_avx(auVar177,auVar286);
  auVar287._0_4_ = fVar315 * 0.5;
  auVar287._4_4_ = fVar316 * 0.5;
  auVar287._8_4_ = fVar327 * 0.5;
  auVar287._12_4_ = fVar302 * 0.5;
  auVar289 = vsubps_avx(auVar129,auVar287);
  auVar288._0_4_ = fVar197 * 0.0 + fVar231 * 0.5;
  auVar288._4_4_ = fVar199 * 0.0 + fVar233 * 0.5;
  auVar288._8_4_ = fVar201 * 0.0 + fVar236 * 0.5;
  auVar288._12_4_ = fVar228 * 0.0 + fVar251 * 0.5;
  auVar345._0_4_ = fVar141 * 0.5;
  auVar345._4_4_ = fVar142 * 0.5;
  auVar345._8_4_ = fVar171 * 0.5;
  auVar345._12_4_ = fVar196 * 0.5;
  auVar129 = vsubps_avx(auVar288,auVar345);
  local_6f0 = auVar75._0_4_;
  fStack_6ec = auVar75._4_4_;
  fStack_6e8 = auVar75._8_4_;
  auVar329._0_4_ = local_6f0 * 0.0;
  auVar329._4_4_ = fStack_6ec * 0.0;
  auVar329._8_4_ = fStack_6e8 * 0.0;
  auVar329._12_4_ = fVar114 * 0.0;
  auVar346._0_4_ =
       auVar329._0_4_ + fVar141 * 0.16666667 + fVar231 * 0.16666667 + fVar197 * 0.6666667;
  auVar346._4_4_ =
       auVar329._4_4_ + fVar142 * 0.16666667 + fVar233 * 0.16666667 + fVar199 * 0.6666667;
  auVar346._8_4_ =
       auVar329._8_4_ + fVar171 * 0.16666667 + fVar236 * 0.16666667 + fVar201 * 0.6666667;
  auVar346._12_4_ =
       auVar329._12_4_ + fVar196 * 0.16666667 + fVar251 * 0.16666667 + fVar228 * 0.6666667;
  auVar18 = vsubps_avx(auVar129,auVar329);
  auVar150._0_4_ = fVar252 * 0.0 + fVar202 * 0.5;
  auVar150._4_4_ = fVar253 * 0.0 + fVar229 * 0.5;
  auVar150._8_4_ = fVar198 * 0.0 + fVar232 * 0.5;
  auVar150._12_4_ = fVar200 * 0.0 + fVar234 * 0.5;
  auVar98._0_4_ = fVar112 * 0.5;
  auVar98._4_4_ = fVar113 * 0.5;
  auVar98._8_4_ = fVar314 * 0.5;
  auVar98._12_4_ = fVar170 * 0.5;
  auVar129 = vsubps_avx(auVar150,auVar98);
  auVar120._0_4_ = fVar315 * 0.0;
  auVar120._4_4_ = fVar316 * 0.0;
  auVar120._8_4_ = fVar327 * 0.0;
  auVar120._12_4_ = fVar302 * 0.0;
  auVar151._0_4_ =
       auVar120._0_4_ + fVar112 * 0.16666667 + fVar252 * 0.6666667 + fVar202 * 0.16666667;
  auVar151._4_4_ =
       auVar120._4_4_ + fVar113 * 0.16666667 + fVar253 * 0.6666667 + fVar229 * 0.16666667;
  auVar151._8_4_ =
       auVar120._8_4_ + fVar314 * 0.16666667 + fVar198 * 0.6666667 + fVar232 * 0.16666667;
  auVar151._12_4_ =
       auVar120._12_4_ + fVar170 * 0.16666667 + fVar200 * 0.6666667 + fVar234 * 0.16666667;
  auVar16 = vsubps_avx(auVar129,auVar120);
  auVar129 = vshufps_avx(auVar210,auVar210,0xc9);
  fVar228 = auVar187._0_4_;
  auVar121._0_4_ = fVar228 * auVar129._0_4_;
  fVar231 = auVar187._4_4_;
  auVar121._4_4_ = fVar231 * auVar129._4_4_;
  fVar233 = auVar187._8_4_;
  auVar121._8_4_ = fVar233 * auVar129._8_4_;
  fVar252 = auVar187._12_4_;
  auVar121._12_4_ = fVar252 * auVar129._12_4_;
  auVar129 = vshufps_avx(auVar187,auVar187,0xc9);
  auVar211._0_4_ = auVar129._0_4_ * auVar210._0_4_;
  auVar211._4_4_ = auVar129._4_4_ * auVar210._4_4_;
  auVar211._8_4_ = auVar129._8_4_ * auVar210._8_4_;
  auVar211._12_4_ = auVar129._12_4_ * auVar210._12_4_;
  auVar249 = vsubps_avx(auVar211,auVar121);
  auVar212._0_4_ = auVar129._0_4_ * auVar289._0_4_;
  auVar212._4_4_ = auVar129._4_4_ * auVar289._4_4_;
  auVar212._8_4_ = auVar129._8_4_ * auVar289._8_4_;
  auVar212._12_4_ = auVar129._12_4_ * auVar289._12_4_;
  auVar129 = vshufps_avx(auVar289,auVar289,0xc9);
  auVar178._0_4_ = fVar228 * auVar129._0_4_;
  auVar178._4_4_ = fVar231 * auVar129._4_4_;
  auVar178._8_4_ = fVar233 * auVar129._8_4_;
  auVar178._12_4_ = fVar252 * auVar129._12_4_;
  auVar17 = vsubps_avx(auVar212,auVar178);
  auVar129 = vshufps_avx(auVar151,auVar151,0xc9);
  fVar251 = auVar18._0_4_;
  auVar213._0_4_ = fVar251 * auVar129._0_4_;
  fVar198 = auVar18._4_4_;
  auVar213._4_4_ = fVar198 * auVar129._4_4_;
  fVar200 = auVar18._8_4_;
  auVar213._8_4_ = fVar200 * auVar129._8_4_;
  fVar229 = auVar18._12_4_;
  auVar213._12_4_ = fVar229 * auVar129._12_4_;
  auVar129 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar152._0_4_ = auVar129._0_4_ * auVar151._0_4_;
  auVar152._4_4_ = auVar129._4_4_ * auVar151._4_4_;
  auVar152._8_4_ = auVar129._8_4_ * auVar151._8_4_;
  auVar152._12_4_ = auVar129._12_4_ * auVar151._12_4_;
  auVar208 = vsubps_avx(auVar152,auVar213);
  auVar249 = vshufps_avx(auVar249,auVar249,0xc9);
  auVar214._0_4_ = auVar129._0_4_ * auVar16._0_4_;
  auVar214._4_4_ = auVar129._4_4_ * auVar16._4_4_;
  auVar214._8_4_ = auVar129._8_4_ * auVar16._8_4_;
  auVar214._12_4_ = auVar129._12_4_ * auVar16._12_4_;
  auVar129 = vdpps_avx(auVar249,auVar249,0x7f);
  auVar289 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar99._0_4_ = fVar251 * auVar289._0_4_;
  auVar99._4_4_ = fVar198 * auVar289._4_4_;
  auVar99._8_4_ = fVar200 * auVar289._8_4_;
  auVar99._12_4_ = fVar229 * auVar289._12_4_;
  auVar88 = vsubps_avx(auVar214,auVar99);
  fVar114 = auVar129._0_4_;
  auVar90 = ZEXT416((uint)fVar114);
  auVar289 = vrsqrtss_avx(auVar90,auVar90);
  fVar141 = auVar289._0_4_;
  auVar16 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar289 = vdpps_avx(auVar249,auVar16,0x7f);
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar179._0_4_ = auVar129._0_4_ * auVar16._0_4_;
  auVar179._4_4_ = auVar129._4_4_ * auVar16._4_4_;
  auVar179._8_4_ = auVar129._8_4_ * auVar16._8_4_;
  auVar179._12_4_ = auVar129._12_4_ * auVar16._12_4_;
  auVar129 = vshufps_avx(auVar289,auVar289,0);
  auVar360._0_4_ = auVar129._0_4_ * auVar249._0_4_;
  auVar360._4_4_ = auVar129._4_4_ * auVar249._4_4_;
  auVar360._8_4_ = auVar129._8_4_ * auVar249._8_4_;
  auVar360._12_4_ = auVar129._12_4_ * auVar249._12_4_;
  auVar89 = vsubps_avx(auVar179,auVar360);
  auVar129 = vrcpss_avx(auVar90,auVar90);
  auVar129 = ZEXT416((uint)(auVar129._0_4_ * (2.0 - fVar114 * auVar129._0_4_)));
  auVar16 = vshufps_avx(auVar129,auVar129,0);
  auVar17 = vshufps_avx(auVar208,auVar208,0xc9);
  auVar129 = vdpps_avx(auVar17,auVar17,0x7f);
  auVar289 = ZEXT416((uint)(fVar141 * 1.5 - fVar114 * 0.5 * fVar141 * fVar141 * fVar141));
  auVar208 = vshufps_avx(auVar289,auVar289,0);
  fVar114 = auVar249._0_4_ * auVar208._0_4_;
  fVar141 = auVar249._4_4_ * auVar208._4_4_;
  fVar142 = auVar249._8_4_ * auVar208._8_4_;
  fVar171 = auVar249._12_4_ * auVar208._12_4_;
  fVar196 = auVar129._0_4_;
  auVar90 = ZEXT416((uint)fVar196);
  auVar289 = vrsqrtss_avx(auVar90,auVar90);
  fVar197 = auVar289._0_4_;
  auVar249 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar289 = vdpps_avx(auVar17,auVar249,0x7f);
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar100._0_4_ = auVar129._0_4_ * auVar249._0_4_;
  auVar100._4_4_ = auVar129._4_4_ * auVar249._4_4_;
  auVar100._8_4_ = auVar129._8_4_ * auVar249._8_4_;
  auVar100._12_4_ = auVar129._12_4_ * auVar249._12_4_;
  auVar129 = vshufps_avx(auVar289,auVar289,0);
  auVar361._0_4_ = auVar129._0_4_ * auVar17._0_4_;
  auVar361._4_4_ = auVar129._4_4_ * auVar17._4_4_;
  auVar361._8_4_ = auVar129._8_4_ * auVar17._8_4_;
  auVar361._12_4_ = auVar129._12_4_ * auVar17._12_4_;
  auVar88 = vsubps_avx(auVar100,auVar361);
  auVar129 = vrcpss_avx(auVar90,auVar90);
  auVar129 = ZEXT416((uint)(auVar129._0_4_ * (2.0 - fVar196 * auVar129._0_4_)));
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar289 = ZEXT416((uint)(fVar197 * 1.5 - fVar196 * 0.5 * fVar197 * fVar197 * fVar197));
  auVar289 = vshufps_avx(auVar289,auVar289,0);
  fVar196 = auVar17._0_4_ * auVar289._0_4_;
  fVar197 = auVar17._4_4_ * auVar289._4_4_;
  fVar199 = auVar17._8_4_ * auVar289._8_4_;
  fVar201 = auVar17._12_4_ * auVar289._12_4_;
  auVar249 = vshufps_avx(auVar187,auVar187,0xff);
  auVar17 = vshufps_avx(_local_680,_local_680,0xff);
  auVar122._0_4_ = auVar17._0_4_ * fVar114;
  auVar122._4_4_ = auVar17._4_4_ * fVar141;
  auVar122._8_4_ = auVar17._8_4_ * fVar142;
  auVar122._12_4_ = auVar17._12_4_ * fVar171;
  auVar153._0_4_ =
       auVar249._0_4_ * fVar114 + auVar17._0_4_ * auVar208._0_4_ * auVar89._0_4_ * auVar16._0_4_;
  auVar153._4_4_ =
       auVar249._4_4_ * fVar141 + auVar17._4_4_ * auVar208._4_4_ * auVar89._4_4_ * auVar16._4_4_;
  auVar153._8_4_ =
       auVar249._8_4_ * fVar142 + auVar17._8_4_ * auVar208._8_4_ * auVar89._8_4_ * auVar16._8_4_;
  auVar153._12_4_ =
       auVar249._12_4_ * fVar171 +
       auVar17._12_4_ * auVar208._12_4_ * auVar89._12_4_ * auVar16._12_4_;
  auVar17 = vsubps_avx(_local_680,auVar122);
  local_680._0_4_ = (float)local_680._0_4_ + auVar122._0_4_;
  local_680._4_4_ = (float)local_680._4_4_ + auVar122._4_4_;
  fStack_678 = fStack_678 + auVar122._8_4_;
  fStack_674 = fStack_674 + auVar122._12_4_;
  auVar208 = vsubps_avx(auVar187,auVar153);
  auVar249 = vshufps_avx(auVar18,auVar18,0xff);
  auVar16 = vshufps_avx(auVar346,auVar346,0xff);
  auVar215._0_4_ = auVar16._0_4_ * fVar196;
  auVar215._4_4_ = auVar16._4_4_ * fVar197;
  auVar215._8_4_ = auVar16._8_4_ * fVar199;
  auVar215._12_4_ = auVar16._12_4_ * fVar201;
  auVar154._0_4_ =
       auVar249._0_4_ * fVar196 + auVar16._0_4_ * auVar289._0_4_ * auVar88._0_4_ * auVar129._0_4_;
  auVar154._4_4_ =
       auVar249._4_4_ * fVar197 + auVar16._4_4_ * auVar289._4_4_ * auVar88._4_4_ * auVar129._4_4_;
  auVar154._8_4_ =
       auVar249._8_4_ * fVar199 + auVar16._8_4_ * auVar289._8_4_ * auVar88._8_4_ * auVar129._8_4_;
  auVar154._12_4_ =
       auVar249._12_4_ * fVar201 +
       auVar16._12_4_ * auVar289._12_4_ * auVar88._12_4_ * auVar129._12_4_;
  auVar249 = vsubps_avx(auVar346,auVar215);
  auVar362._0_4_ = auVar346._0_4_ + auVar215._0_4_;
  auVar362._4_4_ = auVar346._4_4_ + auVar215._4_4_;
  auVar362._8_4_ = auVar346._8_4_ + auVar215._8_4_;
  auVar362._12_4_ = auVar346._12_4_ + auVar215._12_4_;
  auVar16 = vsubps_avx(auVar18,auVar154);
  local_600 = auVar188._0_4_;
  fStack_5fc = auVar188._4_4_;
  fStack_5f8 = auVar188._8_4_;
  fStack_5f4 = auVar188._12_4_;
  local_660 = auVar157._0_4_;
  fStack_65c = auVar157._4_4_;
  fStack_658 = auVar157._8_4_;
  fStack_654 = auVar157._12_4_;
  auVar129 = vshufps_avx(ZEXT416((uint)fVar254),ZEXT416((uint)fVar254),0);
  auVar289 = vshufps_avx(ZEXT416((uint)(1.0 - fVar254)),ZEXT416((uint)(1.0 - fVar254)),0);
  fVar171 = auVar129._0_4_;
  fVar196 = auVar129._4_4_;
  fVar197 = auVar129._8_4_;
  fVar199 = auVar129._12_4_;
  fVar114 = auVar289._0_4_;
  fVar141 = auVar289._4_4_;
  fVar254 = auVar289._8_4_;
  fVar142 = auVar289._12_4_;
  local_4a0._0_4_ = fVar114 * local_660 + fVar171 * auVar17._0_4_;
  local_4a0._4_4_ = fVar141 * fStack_65c + fVar196 * auVar17._4_4_;
  fStack_498 = fVar254 * fStack_658 + fVar197 * auVar17._8_4_;
  fStack_494 = fVar142 * fStack_654 + fVar199 * auVar17._12_4_;
  fVar236 = (local_660 + local_600 * 0.33333334) * fVar114 +
            (auVar17._0_4_ + auVar208._0_4_ * 0.33333334) * fVar171;
  fVar253 = (fStack_65c + fStack_5fc * 0.33333334) * fVar141 +
            (auVar17._4_4_ + auVar208._4_4_ * 0.33333334) * fVar196;
  fVar202 = (fStack_658 + fStack_5f8 * 0.33333334) * fVar254 +
            (auVar17._8_4_ + auVar208._8_4_ * 0.33333334) * fVar197;
  fVar234 = (fStack_654 + fStack_5f4 * 0.33333334) * fVar142 +
            (auVar17._12_4_ + auVar208._12_4_ * 0.33333334) * fVar199;
  local_5e0 = auVar128._0_4_;
  fStack_5dc = auVar128._4_4_;
  fStack_5d8 = auVar128._8_4_;
  fStack_5d4 = auVar128._12_4_;
  auVar240._0_4_ = local_5e0 * 0.33333334;
  auVar240._4_4_ = fStack_5dc * 0.33333334;
  auVar240._8_4_ = fStack_5d8 * 0.33333334;
  auVar240._12_4_ = fStack_5d4 * 0.33333334;
  auVar129 = vsubps_avx(auVar103,auVar240);
  auVar290._0_4_ = (fVar230 + auVar96._0_4_) * 0.33333334;
  auVar290._4_4_ = (fVar336 + auVar96._4_4_) * 0.33333334;
  auVar290._8_4_ = (fVar235 + auVar96._8_4_) * 0.33333334;
  auVar290._12_4_ = (fVar337 + auVar96._12_4_) * 0.33333334;
  auVar289 = vsubps_avx(_local_640,auVar290);
  auVar216._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar216._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar216._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar216._12_4_ = auVar16._12_4_ * 0.33333334;
  auVar16 = vsubps_avx(auVar249,auVar216);
  auVar155._0_4_ = (fVar251 + auVar154._0_4_) * 0.33333334;
  auVar155._4_4_ = (fVar198 + auVar154._4_4_) * 0.33333334;
  auVar155._8_4_ = (fVar200 + auVar154._8_4_) * 0.33333334;
  auVar155._12_4_ = (fVar229 + auVar154._12_4_) * 0.33333334;
  auVar17 = vsubps_avx(auVar362,auVar155);
  local_4b0._0_4_ = fVar114 * auVar129._0_4_ + fVar171 * auVar16._0_4_;
  local_4b0._4_4_ = fVar141 * auVar129._4_4_ + fVar196 * auVar16._4_4_;
  fStack_4a8 = fVar254 * auVar129._8_4_ + fVar197 * auVar16._8_4_;
  fStack_4a4 = fVar142 * auVar129._12_4_ + fVar199 * auVar16._12_4_;
  local_4c0._0_4_ = auVar249._0_4_ * fVar171 + auVar103._0_4_ * fVar114;
  local_4c0._4_4_ = auVar249._4_4_ * fVar196 + auVar103._4_4_ * fVar141;
  fStack_4b8 = auVar249._8_4_ * fVar197 + auVar103._8_4_ * fVar254;
  fStack_4b4 = auVar249._12_4_ * fVar199 + auVar103._12_4_ * fVar142;
  local_4d0._0_4_ = fVar114 * (float)local_6b0._0_4_ + fVar171 * (float)local_680._0_4_;
  local_4d0._4_4_ = fVar141 * (float)local_6b0._4_4_ + fVar196 * (float)local_680._4_4_;
  fStack_4c8 = fVar254 * fStack_6a8 + fVar197 * fStack_678;
  fStack_4c4 = fVar142 * fStack_6a4 + fVar199 * fStack_674;
  fVar251 = fVar114 * ((float)local_6b0._0_4_ + (fVar143 + auVar209._0_4_) * 0.33333334) +
            ((fVar228 + auVar153._0_4_) * 0.33333334 + (float)local_680._0_4_) * fVar171;
  fVar198 = fVar141 * ((float)local_6b0._4_4_ + (fVar168 + auVar209._4_4_) * 0.33333334) +
            ((fVar231 + auVar153._4_4_) * 0.33333334 + (float)local_680._4_4_) * fVar196;
  fVar229 = fVar254 * (fStack_6a8 + (fVar169 + auVar209._8_4_) * 0.33333334) +
            ((fVar233 + auVar153._8_4_) * 0.33333334 + fStack_678) * fVar197;
  fVar112 = fVar142 * (fStack_6a4 + (fVar335 + auVar209._12_4_) * 0.33333334) +
            ((fVar252 + auVar153._12_4_) * 0.33333334 + fStack_674) * fVar199;
  fVar252 = auVar289._0_4_ * fVar114 + fVar171 * auVar17._0_4_;
  fVar200 = auVar289._4_4_ * fVar141 + fVar196 * auVar17._4_4_;
  fVar232 = auVar289._8_4_ * fVar254 + fVar197 * auVar17._8_4_;
  fVar113 = auVar289._12_4_ * fVar142 + fVar199 * auVar17._12_4_;
  local_4e0._0_4_ = (auVar259._0_4_ + auVar149._0_4_) * fVar114 + auVar362._0_4_ * fVar171;
  local_4e0._4_4_ = (auVar259._4_4_ + auVar149._4_4_) * fVar141 + auVar362._4_4_ * fVar196;
  fStack_4d8 = (auVar259._8_4_ + auVar149._8_4_) * fVar254 + auVar362._8_4_ * fVar197;
  fStack_4d4 = (auVar259._12_4_ + auVar149._12_4_) * fVar142 + auVar362._12_4_ * fVar199;
  auVar129 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar129 = vinsertps_avx(auVar129,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_360 = vsubps_avx(_local_4a0,auVar129);
  auVar249 = vmovsldup_avx(local_360);
  auVar289 = vmovshdup_avx(local_360);
  auVar16 = vshufps_avx(local_360,local_360,0xaa);
  fVar114 = pre->ray_space[k].vx.field_0.m128[0];
  fVar141 = pre->ray_space[k].vx.field_0.m128[1];
  fVar254 = pre->ray_space[k].vx.field_0.m128[2];
  fVar142 = pre->ray_space[k].vx.field_0.m128[3];
  fVar171 = pre->ray_space[k].vy.field_0.m128[0];
  fVar196 = pre->ray_space[k].vy.field_0.m128[1];
  fVar197 = pre->ray_space[k].vy.field_0.m128[2];
  fVar199 = pre->ray_space[k].vy.field_0.m128[3];
  fVar201 = pre->ray_space[k].vz.field_0.m128[0];
  fVar228 = pre->ray_space[k].vz.field_0.m128[1];
  fVar231 = pre->ray_space[k].vz.field_0.m128[2];
  fVar233 = pre->ray_space[k].vz.field_0.m128[3];
  local_5b0._0_4_ = fVar114 * auVar249._0_4_ + fVar171 * auVar289._0_4_ + fVar201 * auVar16._0_4_;
  local_5b0._4_4_ = fVar141 * auVar249._4_4_ + fVar196 * auVar289._4_4_ + fVar228 * auVar16._4_4_;
  fStack_5a8 = fVar254 * auVar249._8_4_ + fVar197 * auVar289._8_4_ + fVar231 * auVar16._8_4_;
  fStack_5a4 = fVar142 * auVar249._12_4_ + fVar199 * auVar289._12_4_ + fVar233 * auVar16._12_4_;
  auVar69._4_4_ = fVar253;
  auVar69._0_4_ = fVar236;
  auVar69._8_4_ = fVar202;
  auVar69._12_4_ = fVar234;
  local_370 = vsubps_avx(auVar69,auVar129);
  auVar16 = vshufps_avx(local_370,local_370,0xaa);
  auVar289 = vmovshdup_avx(local_370);
  auVar249 = vmovsldup_avx(local_370);
  auVar363._0_8_ =
       CONCAT44(fVar141 * auVar249._4_4_ + fVar196 * auVar289._4_4_ + fVar228 * auVar16._4_4_,
                fVar114 * auVar249._0_4_ + fVar171 * auVar289._0_4_ + fVar201 * auVar16._0_4_);
  auVar363._8_4_ = fVar254 * auVar249._8_4_ + fVar197 * auVar289._8_4_ + fVar231 * auVar16._8_4_;
  auVar363._12_4_ = fVar142 * auVar249._12_4_ + fVar199 * auVar289._12_4_ + fVar233 * auVar16._12_4_
  ;
  local_380 = vsubps_avx(_local_4b0,auVar129);
  auVar16 = vshufps_avx(local_380,local_380,0xaa);
  auVar289 = vmovshdup_avx(local_380);
  auVar249 = vmovsldup_avx(local_380);
  auVar347._0_4_ = fVar114 * auVar249._0_4_ + fVar171 * auVar289._0_4_ + fVar201 * auVar16._0_4_;
  auVar347._4_4_ = fVar141 * auVar249._4_4_ + fVar196 * auVar289._4_4_ + fVar228 * auVar16._4_4_;
  auVar347._8_4_ = fVar254 * auVar249._8_4_ + fVar197 * auVar289._8_4_ + fVar231 * auVar16._8_4_;
  auVar347._12_4_ = fVar142 * auVar249._12_4_ + fVar199 * auVar289._12_4_ + fVar233 * auVar16._12_4_
  ;
  local_390 = vsubps_avx(_local_4c0,auVar129);
  auVar16 = vshufps_avx(local_390,local_390,0xaa);
  auVar289 = vmovshdup_avx(local_390);
  auVar249 = vmovsldup_avx(local_390);
  auVar123._0_4_ = auVar249._0_4_ * fVar114 + auVar289._0_4_ * fVar171 + fVar201 * auVar16._0_4_;
  auVar123._4_4_ = auVar249._4_4_ * fVar141 + auVar289._4_4_ * fVar196 + fVar228 * auVar16._4_4_;
  auVar123._8_4_ = auVar249._8_4_ * fVar254 + auVar289._8_4_ * fVar197 + fVar231 * auVar16._8_4_;
  auVar123._12_4_ = auVar249._12_4_ * fVar142 + auVar289._12_4_ * fVar199 + fVar233 * auVar16._12_4_
  ;
  local_3a0 = vsubps_avx(_local_4d0,auVar129);
  auVar16 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar289 = vmovshdup_avx(local_3a0);
  auVar249 = vmovsldup_avx(local_3a0);
  auVar291._0_4_ = auVar249._0_4_ * fVar114 + auVar289._0_4_ * fVar171 + auVar16._0_4_ * fVar201;
  auVar291._4_4_ = auVar249._4_4_ * fVar141 + auVar289._4_4_ * fVar196 + auVar16._4_4_ * fVar228;
  auVar291._8_4_ = auVar249._8_4_ * fVar254 + auVar289._8_4_ * fVar197 + auVar16._8_4_ * fVar231;
  auVar291._12_4_ = auVar249._12_4_ * fVar142 + auVar289._12_4_ * fVar199 + auVar16._12_4_ * fVar233
  ;
  auVar67._4_4_ = fVar198;
  auVar67._0_4_ = fVar251;
  auVar67._8_4_ = fVar229;
  auVar67._12_4_ = fVar112;
  local_3b0 = vsubps_avx(auVar67,auVar129);
  auVar16 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar289 = vmovshdup_avx(local_3b0);
  auVar249 = vmovsldup_avx(local_3b0);
  auVar304._0_4_ = auVar249._0_4_ * fVar114 + auVar289._0_4_ * fVar171 + auVar16._0_4_ * fVar201;
  auVar304._4_4_ = auVar249._4_4_ * fVar141 + auVar289._4_4_ * fVar196 + auVar16._4_4_ * fVar228;
  auVar304._8_4_ = auVar249._8_4_ * fVar254 + auVar289._8_4_ * fVar197 + auVar16._8_4_ * fVar231;
  auVar304._12_4_ = auVar249._12_4_ * fVar142 + auVar289._12_4_ * fVar199 + auVar16._12_4_ * fVar233
  ;
  auVar65._4_4_ = fVar200;
  auVar65._0_4_ = fVar252;
  auVar65._8_4_ = fVar232;
  auVar65._12_4_ = fVar113;
  local_3c0 = vsubps_avx(auVar65,auVar129);
  auVar16 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar289 = vmovshdup_avx(local_3c0);
  auVar249 = vmovsldup_avx(local_3c0);
  auVar321._0_4_ = auVar249._0_4_ * fVar114 + auVar289._0_4_ * fVar171 + auVar16._0_4_ * fVar201;
  auVar321._4_4_ = auVar249._4_4_ * fVar141 + auVar289._4_4_ * fVar196 + auVar16._4_4_ * fVar228;
  auVar321._8_4_ = auVar249._8_4_ * fVar254 + auVar289._8_4_ * fVar197 + auVar16._8_4_ * fVar231;
  auVar321._12_4_ = auVar249._12_4_ * fVar142 + auVar289._12_4_ * fVar199 + auVar16._12_4_ * fVar233
  ;
  local_3d0 = vsubps_avx(_local_4e0,auVar129);
  auVar249 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar129 = vmovshdup_avx(local_3d0);
  auVar289 = vmovsldup_avx(local_3d0);
  auVar101._0_4_ = fVar114 * auVar289._0_4_ + fVar171 * auVar129._0_4_ + fVar201 * auVar249._0_4_;
  auVar101._4_4_ = fVar141 * auVar289._4_4_ + fVar196 * auVar129._4_4_ + fVar228 * auVar249._4_4_;
  auVar101._8_4_ = fVar254 * auVar289._8_4_ + fVar197 * auVar129._8_4_ + fVar231 * auVar249._8_4_;
  auVar101._12_4_ =
       fVar142 * auVar289._12_4_ + fVar199 * auVar129._12_4_ + fVar233 * auVar249._12_4_;
  auVar16 = vmovlhps_avx(_local_5b0,auVar291);
  auVar17 = vmovlhps_avx(auVar363,auVar304);
  auVar208 = vmovlhps_avx(auVar347,auVar321);
  _local_490 = vmovlhps_avx(auVar123,auVar101);
  auVar129 = vminps_avx(auVar16,auVar17);
  auVar289 = vminps_avx(auVar208,_local_490);
  auVar249 = vminps_avx(auVar129,auVar289);
  auVar129 = vmaxps_avx(auVar16,auVar17);
  auVar289 = vmaxps_avx(auVar208,_local_490);
  auVar129 = vmaxps_avx(auVar129,auVar289);
  auVar289 = vshufpd_avx(auVar249,auVar249,3);
  auVar249 = vminps_avx(auVar249,auVar289);
  auVar289 = vshufpd_avx(auVar129,auVar129,3);
  auVar289 = vmaxps_avx(auVar129,auVar289);
  auVar260._8_4_ = 0x7fffffff;
  auVar260._0_8_ = 0x7fffffff7fffffff;
  auVar260._12_4_ = 0x7fffffff;
  auVar129 = vandps_avx(auVar249,auVar260);
  auVar289 = vandps_avx(auVar289,auVar260);
  auVar129 = vmaxps_avx(auVar129,auVar289);
  auVar289 = vmovshdup_avx(auVar129);
  auVar129 = vmaxss_avx(auVar289,auVar129);
  local_508 = uVar77 + 0xf;
  fVar141 = auVar129._0_4_ * 9.536743e-07;
  register0x00001548 = auVar363._0_8_;
  local_480 = auVar363._0_8_;
  auVar129 = vshufps_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),0);
  local_280._16_16_ = auVar129;
  local_280._0_16_ = auVar129;
  auVar102._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
  auVar102._8_4_ = auVar129._8_4_ ^ 0x80000000;
  auVar102._12_4_ = auVar129._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar102;
  local_2a0._0_16_ = auVar102;
  auVar129 = vshufps_avx(ZEXT416(uVar85),ZEXT416(uVar85),0);
  local_2c0._16_16_ = auVar129;
  local_2c0._0_16_ = auVar129;
  auVar129 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar80 * 4 + 6)),0);
  local_2e0._16_16_ = auVar129;
  local_2e0._0_16_ = auVar129;
  bVar76 = false;
  uVar83 = 0;
  fVar114 = *(float *)(ray + k * 4 + 0x60);
  _local_330 = vsubps_avx(auVar17,auVar16);
  _local_340 = vsubps_avx(auVar208,auVar17);
  _local_350 = vsubps_avx(_local_490,auVar208);
  _local_400 = vsubps_avx(_local_4d0,_local_4a0);
  auVar68._4_4_ = fVar198;
  auVar68._0_4_ = fVar251;
  auVar68._8_4_ = fVar229;
  auVar68._12_4_ = fVar112;
  auVar70._4_4_ = fVar253;
  auVar70._0_4_ = fVar236;
  auVar70._8_4_ = fVar202;
  auVar70._12_4_ = fVar234;
  _local_410 = vsubps_avx(auVar68,auVar70);
  auVar66._4_4_ = fVar200;
  auVar66._0_4_ = fVar252;
  auVar66._8_4_ = fVar232;
  auVar66._12_4_ = fVar113;
  _local_420 = vsubps_avx(auVar66,_local_4b0);
  _local_430 = vsubps_avx(_local_4e0,_local_4c0);
  _local_6b0 = ZEXT816(0x3f80000000000000);
  local_3e0 = _local_6b0;
  do {
    auVar129 = vshufps_avx(_local_6b0,_local_6b0,0x50);
    auVar377._8_4_ = 0x3f800000;
    auVar377._0_8_ = &DAT_3f8000003f800000;
    auVar377._12_4_ = 0x3f800000;
    auVar380._16_4_ = 0x3f800000;
    auVar380._0_16_ = auVar377;
    auVar380._20_4_ = 0x3f800000;
    auVar380._24_4_ = 0x3f800000;
    auVar380._28_4_ = 0x3f800000;
    auVar289 = vsubps_avx(auVar377,auVar129);
    fVar254 = auVar129._0_4_;
    fVar142 = auVar129._4_4_;
    fVar171 = auVar129._8_4_;
    fVar196 = auVar129._12_4_;
    fVar197 = auVar289._0_4_;
    fVar199 = auVar289._4_4_;
    fVar201 = auVar289._8_4_;
    fVar228 = auVar289._12_4_;
    auVar156._0_4_ = auVar291._0_4_ * fVar254 + fVar197 * (float)local_5b0._0_4_;
    auVar156._4_4_ = auVar291._4_4_ * fVar142 + fVar199 * (float)local_5b0._4_4_;
    auVar156._8_4_ = auVar291._0_4_ * fVar171 + fVar201 * (float)local_5b0._0_4_;
    auVar156._12_4_ = auVar291._4_4_ * fVar196 + fVar228 * (float)local_5b0._4_4_;
    auVar124._0_4_ = auVar304._0_4_ * fVar254 + local_480._0_4_ * fVar197;
    auVar124._4_4_ = auVar304._4_4_ * fVar142 + local_480._4_4_ * fVar199;
    auVar124._8_4_ = auVar304._0_4_ * fVar171 + local_480._8_4_ * fVar201;
    auVar124._12_4_ = auVar304._4_4_ * fVar196 + local_480._12_4_ * fVar228;
    auVar217._0_4_ = auVar321._0_4_ * fVar254 + auVar347._0_4_ * fVar197;
    auVar217._4_4_ = auVar321._4_4_ * fVar142 + auVar347._4_4_ * fVar199;
    auVar217._8_4_ = auVar321._0_4_ * fVar171 + auVar347._0_4_ * fVar201;
    auVar217._12_4_ = auVar321._4_4_ * fVar196 + auVar347._4_4_ * fVar228;
    auVar180._0_4_ = auVar101._0_4_ * fVar254 + auVar123._0_4_ * fVar197;
    auVar180._4_4_ = auVar101._4_4_ * fVar142 + auVar123._4_4_ * fVar199;
    auVar180._8_4_ = auVar101._0_4_ * fVar171 + auVar123._0_4_ * fVar201;
    auVar180._12_4_ = auVar101._4_4_ * fVar196 + auVar123._4_4_ * fVar228;
    auVar129 = vmovshdup_avx(local_3e0);
    auVar289 = vshufps_avx(local_3e0,local_3e0,0);
    auVar300._16_16_ = auVar289;
    auVar300._0_16_ = auVar289;
    auVar249 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar107._16_16_ = auVar249;
    auVar107._0_16_ = auVar249;
    auVar106 = vsubps_avx(auVar107,auVar300);
    auVar249 = vshufps_avx(auVar156,auVar156,0);
    auVar188 = vshufps_avx(auVar156,auVar156,0x55);
    auVar128 = vshufps_avx(auVar124,auVar124,0);
    auVar187 = vshufps_avx(auVar124,auVar124,0x55);
    auVar103 = vshufps_avx(auVar217,auVar217,0);
    auVar157 = vshufps_avx(auVar217,auVar217,0x55);
    auVar18 = vshufps_avx(auVar180,auVar180,0);
    auVar88 = vshufps_avx(auVar180,auVar180,0x55);
    auVar129 = ZEXT416((uint)((auVar129._0_4_ - local_3e0._0_4_) * 0.04761905));
    auVar129 = vshufps_avx(auVar129,auVar129,0);
    auVar313._0_4_ = auVar289._0_4_ + auVar106._0_4_ * 0.0;
    auVar313._4_4_ = auVar289._4_4_ + auVar106._4_4_ * 0.14285715;
    auVar313._8_4_ = auVar289._8_4_ + auVar106._8_4_ * 0.2857143;
    auVar313._12_4_ = auVar289._12_4_ + auVar106._12_4_ * 0.42857146;
    auVar313._16_4_ = auVar289._0_4_ + auVar106._16_4_ * 0.5714286;
    auVar313._20_4_ = auVar289._4_4_ + auVar106._20_4_ * 0.71428573;
    auVar313._24_4_ = auVar289._8_4_ + auVar106._24_4_ * 0.8571429;
    auVar313._28_4_ = auVar289._12_4_ + auVar106._28_4_;
    auVar21 = vsubps_avx(auVar380,auVar313);
    fVar316 = auVar128._0_4_;
    fVar302 = auVar128._4_4_;
    fVar230 = auVar128._8_4_;
    fVar235 = auVar128._12_4_;
    fVar254 = auVar21._0_4_;
    fVar197 = auVar21._4_4_;
    fVar231 = auVar21._8_4_;
    fVar315 = auVar21._12_4_;
    fVar368 = auVar249._12_4_;
    fVar143 = auVar21._16_4_;
    fVar168 = auVar21._20_4_;
    fVar169 = auVar21._24_4_;
    fVar266 = auVar187._0_4_;
    fVar267 = auVar187._4_4_;
    fVar268 = auVar187._8_4_;
    fVar358 = auVar187._12_4_;
    local_620 = auVar188._0_4_;
    fStack_61c = auVar188._4_4_;
    fStack_618 = auVar188._8_4_;
    fStack_614 = auVar188._12_4_;
    fVar142 = auVar103._0_4_;
    fVar196 = auVar103._4_4_;
    fVar201 = auVar103._8_4_;
    fVar233 = auVar103._12_4_;
    fVar327 = auVar313._0_4_ * fVar142 + fVar316 * fVar254;
    fVar335 = auVar313._4_4_ * fVar196 + fVar302 * fVar197;
    fVar336 = auVar313._8_4_ * fVar201 + fVar230 * fVar231;
    fVar337 = auVar313._12_4_ * fVar233 + fVar235 * fVar315;
    fVar338 = auVar313._16_4_ * fVar142 + fVar316 * fVar143;
    fVar339 = auVar313._20_4_ * fVar196 + fVar302 * fVar168;
    fVar340 = auVar313._24_4_ * fVar201 + fVar230 * fVar169;
    fVar171 = auVar157._0_4_;
    fVar199 = auVar157._4_4_;
    fVar228 = auVar157._8_4_;
    fVar314 = auVar157._12_4_;
    fVar341 = auVar313._0_4_ * fVar171 + fVar266 * fVar254;
    fVar349 = auVar313._4_4_ * fVar199 + fVar267 * fVar197;
    fVar350 = auVar313._8_4_ * fVar228 + fVar268 * fVar231;
    fVar351 = auVar313._12_4_ * fVar314 + fVar358 * fVar315;
    fVar352 = auVar313._16_4_ * fVar171 + fVar266 * fVar143;
    fVar354 = auVar313._20_4_ * fVar199 + fVar267 * fVar168;
    fVar356 = auVar313._24_4_ * fVar228 + fVar268 * fVar169;
    auVar289 = vshufps_avx(auVar156,auVar156,0xaa);
    auVar188 = vshufps_avx(auVar156,auVar156,0xff);
    fVar170 = fVar233 + 0.0;
    auVar128 = vshufps_avx(auVar124,auVar124,0xaa);
    auVar187 = vshufps_avx(auVar124,auVar124,0xff);
    auVar108._0_4_ =
         fVar254 * (fVar316 * auVar313._0_4_ + auVar249._0_4_ * fVar254) + auVar313._0_4_ * fVar327;
    auVar108._4_4_ =
         fVar197 * (fVar302 * auVar313._4_4_ + auVar249._4_4_ * fVar197) + auVar313._4_4_ * fVar335;
    auVar108._8_4_ =
         fVar231 * (fVar230 * auVar313._8_4_ + auVar249._8_4_ * fVar231) + auVar313._8_4_ * fVar336;
    auVar108._12_4_ =
         fVar315 * (fVar235 * auVar313._12_4_ + fVar368 * fVar315) + auVar313._12_4_ * fVar337;
    auVar108._16_4_ =
         fVar143 * (fVar316 * auVar313._16_4_ + auVar249._0_4_ * fVar143) +
         auVar313._16_4_ * fVar338;
    auVar108._20_4_ =
         fVar168 * (fVar302 * auVar313._20_4_ + auVar249._4_4_ * fVar168) +
         auVar313._20_4_ * fVar339;
    auVar108._24_4_ =
         fVar169 * (fVar230 * auVar313._24_4_ + auVar249._8_4_ * fVar169) +
         auVar313._24_4_ * fVar340;
    auVar108._28_4_ = fVar368 + 1.0 + fVar314;
    auVar192._0_4_ =
         fVar254 * (fVar266 * auVar313._0_4_ + fVar254 * local_620) + auVar313._0_4_ * fVar341;
    auVar192._4_4_ =
         fVar197 * (fVar267 * auVar313._4_4_ + fVar197 * fStack_61c) + auVar313._4_4_ * fVar349;
    auVar192._8_4_ =
         fVar231 * (fVar268 * auVar313._8_4_ + fVar231 * fStack_618) + auVar313._8_4_ * fVar350;
    auVar192._12_4_ =
         fVar315 * (fVar358 * auVar313._12_4_ + fVar315 * fStack_614) + auVar313._12_4_ * fVar351;
    auVar192._16_4_ =
         fVar143 * (fVar266 * auVar313._16_4_ + fVar143 * local_620) + auVar313._16_4_ * fVar352;
    auVar192._20_4_ =
         fVar168 * (fVar267 * auVar313._20_4_ + fVar168 * fStack_61c) + auVar313._20_4_ * fVar354;
    auVar192._24_4_ =
         fVar169 * (fVar268 * auVar313._24_4_ + fVar169 * fStack_618) + auVar313._24_4_ * fVar356;
    auVar192._28_4_ = fVar368 + 1.0 + fVar314;
    auVar225._0_4_ =
         fVar254 * fVar327 + auVar313._0_4_ * (auVar18._0_4_ * auVar313._0_4_ + fVar254 * fVar142);
    auVar225._4_4_ =
         fVar197 * fVar335 + auVar313._4_4_ * (auVar18._4_4_ * auVar313._4_4_ + fVar197 * fVar196);
    auVar225._8_4_ =
         fVar231 * fVar336 + auVar313._8_4_ * (auVar18._8_4_ * auVar313._8_4_ + fVar231 * fVar201);
    auVar225._12_4_ =
         fVar315 * fVar337 +
         auVar313._12_4_ * (auVar18._12_4_ * auVar313._12_4_ + fVar315 * fVar233);
    auVar225._16_4_ =
         fVar143 * fVar338 + auVar313._16_4_ * (auVar18._0_4_ * auVar313._16_4_ + fVar143 * fVar142)
    ;
    auVar225._20_4_ =
         fVar168 * fVar339 + auVar313._20_4_ * (auVar18._4_4_ * auVar313._20_4_ + fVar168 * fVar196)
    ;
    auVar225._24_4_ =
         fVar169 * fVar340 + auVar313._24_4_ * (auVar18._8_4_ * auVar313._24_4_ + fVar169 * fVar201)
    ;
    auVar225._28_4_ = fVar314 + fVar170;
    auVar326._0_4_ =
         fVar254 * fVar341 + auVar313._0_4_ * (auVar88._0_4_ * auVar313._0_4_ + fVar254 * fVar171);
    auVar326._4_4_ =
         fVar197 * fVar349 + auVar313._4_4_ * (auVar88._4_4_ * auVar313._4_4_ + fVar197 * fVar199);
    auVar326._8_4_ =
         fVar231 * fVar350 + auVar313._8_4_ * (auVar88._8_4_ * auVar313._8_4_ + fVar231 * fVar228);
    auVar326._12_4_ =
         fVar315 * fVar351 +
         auVar313._12_4_ * (auVar88._12_4_ * auVar313._12_4_ + fVar315 * fVar314);
    auVar326._16_4_ =
         fVar143 * fVar352 + auVar313._16_4_ * (auVar88._0_4_ * auVar313._16_4_ + fVar143 * fVar171)
    ;
    auVar326._20_4_ =
         fVar168 * fVar354 + auVar313._20_4_ * (auVar88._4_4_ * auVar313._20_4_ + fVar168 * fVar199)
    ;
    auVar326._24_4_ =
         fVar169 * fVar356 + auVar313._24_4_ * (auVar88._8_4_ * auVar313._24_4_ + fVar169 * fVar228)
    ;
    auVar326._28_4_ = fVar170 + fVar314 + 0.0;
    local_1c0._0_4_ = fVar254 * auVar108._0_4_ + auVar313._0_4_ * auVar225._0_4_;
    local_1c0._4_4_ = fVar197 * auVar108._4_4_ + auVar313._4_4_ * auVar225._4_4_;
    local_1c0._8_4_ = fVar231 * auVar108._8_4_ + auVar313._8_4_ * auVar225._8_4_;
    local_1c0._12_4_ = fVar315 * auVar108._12_4_ + auVar313._12_4_ * auVar225._12_4_;
    local_1c0._16_4_ = fVar143 * auVar108._16_4_ + auVar313._16_4_ * auVar225._16_4_;
    local_1c0._20_4_ = fVar168 * auVar108._20_4_ + auVar313._20_4_ * auVar225._20_4_;
    local_1c0._24_4_ = fVar169 * auVar108._24_4_ + auVar313._24_4_ * auVar225._24_4_;
    local_1c0._28_4_ = fVar368 + fVar235 + fVar314 + 0.0;
    local_1e0._0_4_ = fVar254 * auVar192._0_4_ + auVar313._0_4_ * auVar326._0_4_;
    local_1e0._4_4_ = fVar197 * auVar192._4_4_ + auVar313._4_4_ * auVar326._4_4_;
    local_1e0._8_4_ = fVar231 * auVar192._8_4_ + auVar313._8_4_ * auVar326._8_4_;
    local_1e0._12_4_ = fVar315 * auVar192._12_4_ + auVar313._12_4_ * auVar326._12_4_;
    local_1e0._16_4_ = fVar143 * auVar192._16_4_ + auVar313._16_4_ * auVar326._16_4_;
    local_1e0._20_4_ = fVar168 * auVar192._20_4_ + auVar313._20_4_ * auVar326._20_4_;
    local_1e0._24_4_ = fVar169 * auVar192._24_4_ + auVar313._24_4_ * auVar326._24_4_;
    local_1e0._28_4_ = fVar368 + fVar235 + fVar170;
    auVar22 = vsubps_avx(auVar225,auVar108);
    auVar106 = vsubps_avx(auVar326,auVar192);
    local_680._0_4_ = auVar129._0_4_;
    local_680._4_4_ = auVar129._4_4_;
    fStack_678 = auVar129._8_4_;
    fStack_674 = auVar129._12_4_;
    local_220 = (float)local_680._0_4_ * auVar22._0_4_ * 3.0;
    fStack_21c = (float)local_680._4_4_ * auVar22._4_4_ * 3.0;
    auVar23._4_4_ = fStack_21c;
    auVar23._0_4_ = local_220;
    fStack_218 = fStack_678 * auVar22._8_4_ * 3.0;
    auVar23._8_4_ = fStack_218;
    fStack_214 = fStack_674 * auVar22._12_4_ * 3.0;
    auVar23._12_4_ = fStack_214;
    fStack_210 = (float)local_680._0_4_ * auVar22._16_4_ * 3.0;
    auVar23._16_4_ = fStack_210;
    fStack_20c = (float)local_680._4_4_ * auVar22._20_4_ * 3.0;
    auVar23._20_4_ = fStack_20c;
    fStack_208 = fStack_678 * auVar22._24_4_ * 3.0;
    auVar23._24_4_ = fStack_208;
    auVar23._28_4_ = auVar22._28_4_;
    fVar335 = (float)local_680._0_4_ * auVar106._0_4_ * 3.0;
    fVar230 = (float)local_680._4_4_ * auVar106._4_4_ * 3.0;
    auVar24._4_4_ = fVar230;
    auVar24._0_4_ = fVar335;
    fVar336 = fStack_678 * auVar106._8_4_ * 3.0;
    auVar24._8_4_ = fVar336;
    fVar235 = fStack_674 * auVar106._12_4_ * 3.0;
    auVar24._12_4_ = fVar235;
    fVar337 = (float)local_680._0_4_ * auVar106._16_4_ * 3.0;
    auVar24._16_4_ = fVar337;
    fVar338 = (float)local_680._4_4_ * auVar106._20_4_ * 3.0;
    auVar24._20_4_ = fVar338;
    fVar339 = fStack_678 * auVar106._24_4_ * 3.0;
    auVar24._24_4_ = fVar339;
    auVar24._28_4_ = auVar225._28_4_;
    auVar23 = vsubps_avx(local_1c0,auVar23);
    auVar106 = vperm2f128_avx(auVar23,auVar23,1);
    auVar106 = vshufps_avx(auVar106,auVar23,0x30);
    auVar106 = vshufps_avx(auVar23,auVar106,0x29);
    auVar24 = vsubps_avx(local_1e0,auVar24);
    auVar23 = vperm2f128_avx(auVar24,auVar24,1);
    auVar23 = vshufps_avx(auVar23,auVar24,0x30);
    auVar107 = vshufps_avx(auVar24,auVar23,0x29);
    fVar370 = auVar128._0_4_;
    fVar375 = auVar128._4_4_;
    fVar376 = auVar128._8_4_;
    fVar142 = auVar187._0_4_;
    fVar199 = auVar187._4_4_;
    fVar233 = auVar187._8_4_;
    fVar316 = auVar187._12_4_;
    fVar369 = auVar188._12_4_;
    auVar129 = vshufps_avx(auVar217,auVar217,0xaa);
    fVar171 = auVar129._0_4_;
    fVar201 = auVar129._4_4_;
    fVar314 = auVar129._8_4_;
    fVar327 = auVar129._12_4_;
    fVar351 = auVar313._0_4_ * fVar171 + fVar370 * fVar254;
    fVar352 = auVar313._4_4_ * fVar201 + fVar375 * fVar197;
    fVar354 = auVar313._8_4_ * fVar314 + fVar376 * fVar231;
    fVar356 = auVar313._12_4_ * fVar327 + auVar128._12_4_ * fVar315;
    fVar353 = auVar313._16_4_ * fVar171 + fVar370 * fVar143;
    fVar355 = auVar313._20_4_ * fVar201 + fVar375 * fVar168;
    fVar357 = auVar313._24_4_ * fVar314 + fVar376 * fVar169;
    fVar358 = fVar369 + fVar368 + fVar358;
    auVar129 = vshufps_avx(auVar217,auVar217,0xff);
    fVar196 = auVar129._0_4_;
    fVar228 = auVar129._4_4_;
    fVar170 = auVar129._8_4_;
    fVar302 = auVar129._12_4_;
    fVar340 = auVar313._0_4_ * fVar196 + fVar254 * fVar142;
    fVar266 = auVar313._4_4_ * fVar228 + fVar197 * fVar199;
    fVar341 = auVar313._8_4_ * fVar170 + fVar231 * fVar233;
    fVar267 = auVar313._12_4_ * fVar302 + fVar315 * fVar316;
    fVar349 = auVar313._16_4_ * fVar196 + fVar143 * fVar142;
    fVar268 = auVar313._20_4_ * fVar228 + fVar168 * fVar199;
    fVar350 = auVar313._24_4_ * fVar170 + fVar169 * fVar233;
    auVar129 = vshufps_avx(auVar180,auVar180,0xaa);
    auVar249 = vshufps_avx(auVar180,auVar180,0xff);
    fVar368 = auVar249._12_4_;
    auVar109._0_4_ =
         auVar313._0_4_ * fVar351 + fVar254 * (fVar370 * auVar313._0_4_ + auVar289._0_4_ * fVar254);
    auVar109._4_4_ =
         auVar313._4_4_ * fVar352 + fVar197 * (fVar375 * auVar313._4_4_ + auVar289._4_4_ * fVar197);
    auVar109._8_4_ =
         auVar313._8_4_ * fVar354 + fVar231 * (fVar376 * auVar313._8_4_ + auVar289._8_4_ * fVar231);
    auVar109._12_4_ =
         auVar313._12_4_ * fVar356 +
         fVar315 * (auVar128._12_4_ * auVar313._12_4_ + auVar289._12_4_ * fVar315);
    auVar109._16_4_ =
         auVar313._16_4_ * fVar353 +
         fVar143 * (fVar370 * auVar313._16_4_ + auVar289._0_4_ * fVar143);
    auVar109._20_4_ =
         auVar313._20_4_ * fVar355 +
         fVar168 * (fVar375 * auVar313._20_4_ + auVar289._4_4_ * fVar168);
    auVar109._24_4_ =
         auVar313._24_4_ * fVar357 +
         fVar169 * (fVar376 * auVar313._24_4_ + auVar289._8_4_ * fVar169);
    auVar109._28_4_ = fVar368 + auVar24._28_4_ + auVar23._28_4_;
    auVar367._0_4_ =
         auVar313._0_4_ * fVar340 + fVar254 * (auVar313._0_4_ * fVar142 + auVar188._0_4_ * fVar254);
    auVar367._4_4_ =
         auVar313._4_4_ * fVar266 + fVar197 * (auVar313._4_4_ * fVar199 + auVar188._4_4_ * fVar197);
    auVar367._8_4_ =
         auVar313._8_4_ * fVar341 + fVar231 * (auVar313._8_4_ * fVar233 + auVar188._8_4_ * fVar231);
    auVar367._12_4_ =
         auVar313._12_4_ * fVar267 + fVar315 * (auVar313._12_4_ * fVar316 + fVar369 * fVar315);
    auVar367._16_4_ =
         auVar313._16_4_ * fVar349 +
         fVar143 * (auVar313._16_4_ * fVar142 + auVar188._0_4_ * fVar143);
    auVar367._20_4_ =
         auVar313._20_4_ * fVar268 +
         fVar168 * (auVar313._20_4_ * fVar199 + auVar188._4_4_ * fVar168);
    auVar367._24_4_ =
         auVar313._24_4_ * fVar350 +
         fVar169 * (auVar313._24_4_ * fVar233 + auVar188._8_4_ * fVar169);
    auVar367._28_4_ = fVar368 + auVar23._28_4_ + auVar225._28_4_;
    auVar23 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar23 = vshufps_avx(auVar23,local_1c0,0x30);
    auVar108 = vshufps_avx(local_1c0,auVar23,0x29);
    auVar226._0_4_ =
         fVar254 * fVar351 + auVar313._0_4_ * (auVar129._0_4_ * auVar313._0_4_ + fVar254 * fVar171);
    auVar226._4_4_ =
         fVar197 * fVar352 + auVar313._4_4_ * (auVar129._4_4_ * auVar313._4_4_ + fVar197 * fVar201);
    auVar226._8_4_ =
         fVar231 * fVar354 + auVar313._8_4_ * (auVar129._8_4_ * auVar313._8_4_ + fVar231 * fVar314);
    auVar226._12_4_ =
         fVar315 * fVar356 +
         auVar313._12_4_ * (auVar129._12_4_ * auVar313._12_4_ + fVar315 * fVar327);
    auVar226._16_4_ =
         fVar143 * fVar353 +
         auVar313._16_4_ * (auVar129._0_4_ * auVar313._16_4_ + fVar143 * fVar171);
    auVar226._20_4_ =
         fVar168 * fVar355 +
         auVar313._20_4_ * (auVar129._4_4_ * auVar313._20_4_ + fVar168 * fVar201);
    auVar226._24_4_ =
         fVar169 * fVar357 +
         auVar313._24_4_ * (auVar129._8_4_ * auVar313._24_4_ + fVar169 * fVar314);
    auVar226._28_4_ = fVar358 + auVar129._12_4_ + fVar327;
    auVar265._0_4_ =
         fVar254 * fVar340 + auVar313._0_4_ * (auVar249._0_4_ * auVar313._0_4_ + fVar254 * fVar196);
    auVar265._4_4_ =
         fVar197 * fVar266 + auVar313._4_4_ * (auVar249._4_4_ * auVar313._4_4_ + fVar197 * fVar228);
    auVar265._8_4_ =
         fVar231 * fVar341 + auVar313._8_4_ * (auVar249._8_4_ * auVar313._8_4_ + fVar231 * fVar170);
    auVar265._12_4_ =
         fVar315 * fVar267 + auVar313._12_4_ * (fVar368 * auVar313._12_4_ + fVar315 * fVar302);
    auVar265._16_4_ =
         fVar143 * fVar349 +
         auVar313._16_4_ * (auVar249._0_4_ * auVar313._16_4_ + fVar143 * fVar196);
    auVar265._20_4_ =
         fVar168 * fVar268 +
         auVar313._20_4_ * (auVar249._4_4_ * auVar313._20_4_ + fVar168 * fVar228);
    auVar265._24_4_ =
         fVar169 * fVar350 +
         auVar313._24_4_ * (auVar249._8_4_ * auVar313._24_4_ + fVar169 * fVar170);
    auVar265._28_4_ = fVar369 + fVar316 + fVar368 + fVar302;
    auVar281._0_4_ = fVar254 * auVar109._0_4_ + auVar313._0_4_ * auVar226._0_4_;
    auVar281._4_4_ = fVar197 * auVar109._4_4_ + auVar313._4_4_ * auVar226._4_4_;
    auVar281._8_4_ = fVar231 * auVar109._8_4_ + auVar313._8_4_ * auVar226._8_4_;
    auVar281._12_4_ = fVar315 * auVar109._12_4_ + auVar313._12_4_ * auVar226._12_4_;
    auVar281._16_4_ = fVar143 * auVar109._16_4_ + auVar313._16_4_ * auVar226._16_4_;
    auVar281._20_4_ = fVar168 * auVar109._20_4_ + auVar313._20_4_ * auVar226._20_4_;
    auVar281._24_4_ = fVar169 * auVar109._24_4_ + auVar313._24_4_ * auVar226._24_4_;
    auVar281._28_4_ = fVar358 + fVar368 + fVar302;
    auVar301._0_4_ = fVar254 * auVar367._0_4_ + auVar313._0_4_ * auVar265._0_4_;
    auVar301._4_4_ = fVar197 * auVar367._4_4_ + auVar313._4_4_ * auVar265._4_4_;
    auVar301._8_4_ = fVar231 * auVar367._8_4_ + auVar313._8_4_ * auVar265._8_4_;
    auVar301._12_4_ = fVar315 * auVar367._12_4_ + auVar313._12_4_ * auVar265._12_4_;
    auVar301._16_4_ = fVar143 * auVar367._16_4_ + auVar313._16_4_ * auVar265._16_4_;
    auVar301._20_4_ = fVar168 * auVar367._20_4_ + auVar313._20_4_ * auVar265._20_4_;
    auVar301._24_4_ = fVar169 * auVar367._24_4_ + auVar313._24_4_ * auVar265._24_4_;
    auVar301._28_4_ = auVar21._28_4_ + auVar313._28_4_;
    auVar23 = vsubps_avx(auVar226,auVar109);
    auVar21 = vsubps_avx(auVar265,auVar367);
    local_240 = (float)local_680._0_4_ * auVar23._0_4_ * 3.0;
    fStack_23c = (float)local_680._4_4_ * auVar23._4_4_ * 3.0;
    auVar19._4_4_ = fStack_23c;
    auVar19._0_4_ = local_240;
    fStack_238 = fStack_678 * auVar23._8_4_ * 3.0;
    auVar19._8_4_ = fStack_238;
    fStack_234 = fStack_674 * auVar23._12_4_ * 3.0;
    auVar19._12_4_ = fStack_234;
    fStack_230 = (float)local_680._0_4_ * auVar23._16_4_ * 3.0;
    auVar19._16_4_ = fStack_230;
    fStack_22c = (float)local_680._4_4_ * auVar23._20_4_ * 3.0;
    auVar19._20_4_ = fStack_22c;
    fStack_228 = fStack_678 * auVar23._24_4_ * 3.0;
    auVar19._24_4_ = fStack_228;
    auVar19._28_4_ = auVar265._28_4_;
    local_260 = (float)local_680._0_4_ * auVar21._0_4_ * 3.0;
    fStack_25c = (float)local_680._4_4_ * auVar21._4_4_ * 3.0;
    auVar20._4_4_ = fStack_25c;
    auVar20._0_4_ = local_260;
    fStack_258 = fStack_678 * auVar21._8_4_ * 3.0;
    auVar20._8_4_ = fStack_258;
    fStack_254 = fStack_674 * auVar21._12_4_ * 3.0;
    auVar20._12_4_ = fStack_254;
    local_680._0_4_ = (float)local_680._0_4_ * auVar21._16_4_ * 3.0;
    auVar20._16_4_ = local_680._0_4_;
    local_680._4_4_ = (float)local_680._4_4_ * auVar21._20_4_ * 3.0;
    auVar20._20_4_ = local_680._4_4_;
    fStack_678 = fStack_678 * auVar21._24_4_ * 3.0;
    auVar20._24_4_ = fStack_678;
    auVar20._28_4_ = fStack_674;
    auVar23 = vperm2f128_avx(auVar281,auVar281,1);
    auVar23 = vshufps_avx(auVar23,auVar281,0x30);
    auVar109 = vshufps_avx(auVar281,auVar23,0x29);
    auVar21 = vsubps_avx(auVar281,auVar19);
    auVar23 = vperm2f128_avx(auVar21,auVar21,1);
    auVar23 = vshufps_avx(auVar23,auVar21,0x30);
    auVar19 = vshufps_avx(auVar21,auVar23,0x29);
    auVar21 = vsubps_avx(auVar301,auVar20);
    auVar23 = vperm2f128_avx(auVar21,auVar21,1);
    auVar23 = vshufps_avx(auVar23,auVar21,0x30);
    auVar20 = vshufps_avx(auVar21,auVar23,0x29);
    auVar24 = vsubps_avx(auVar281,local_1c0);
    auVar25 = vsubps_avx(auVar109,auVar108);
    fVar254 = auVar25._0_4_ + auVar24._0_4_;
    fVar142 = auVar25._4_4_ + auVar24._4_4_;
    fVar171 = auVar25._8_4_ + auVar24._8_4_;
    fVar196 = auVar25._12_4_ + auVar24._12_4_;
    fVar197 = auVar25._16_4_ + auVar24._16_4_;
    fVar199 = auVar25._20_4_ + auVar24._20_4_;
    fVar201 = auVar25._24_4_ + auVar24._24_4_;
    auVar21 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar21 = vshufps_avx(auVar21,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar21,0x29);
    auVar21 = vperm2f128_avx(auVar301,auVar301,1);
    auVar21 = vshufps_avx(auVar21,auVar301,0x30);
    auVar192 = vshufps_avx(auVar301,auVar21,0x29);
    auVar21 = vsubps_avx(auVar301,local_1e0);
    auVar226 = vsubps_avx(auVar192,local_200);
    fVar228 = auVar21._0_4_ + auVar226._0_4_;
    fVar231 = auVar21._4_4_ + auVar226._4_4_;
    fVar233 = auVar21._8_4_ + auVar226._8_4_;
    fVar314 = auVar21._12_4_ + auVar226._12_4_;
    fVar170 = auVar21._16_4_ + auVar226._16_4_;
    fVar315 = auVar21._20_4_ + auVar226._20_4_;
    fVar316 = auVar21._24_4_ + auVar226._24_4_;
    fVar327 = auVar21._28_4_;
    auVar21._4_4_ = local_1e0._4_4_ * fVar142;
    auVar21._0_4_ = local_1e0._0_4_ * fVar254;
    auVar21._8_4_ = local_1e0._8_4_ * fVar171;
    auVar21._12_4_ = local_1e0._12_4_ * fVar196;
    auVar21._16_4_ = local_1e0._16_4_ * fVar197;
    auVar21._20_4_ = local_1e0._20_4_ * fVar199;
    auVar21._24_4_ = local_1e0._24_4_ * fVar201;
    auVar21._28_4_ = fVar327;
    auVar26._4_4_ = fVar231 * local_1c0._4_4_;
    auVar26._0_4_ = fVar228 * local_1c0._0_4_;
    auVar26._8_4_ = fVar233 * local_1c0._8_4_;
    auVar26._12_4_ = fVar314 * local_1c0._12_4_;
    auVar26._16_4_ = fVar170 * local_1c0._16_4_;
    auVar26._20_4_ = fVar315 * local_1c0._20_4_;
    auVar26._24_4_ = fVar316 * local_1c0._24_4_;
    auVar26._28_4_ = auVar23._28_4_;
    auVar21 = vsubps_avx(auVar21,auVar26);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar22._28_4_;
    fVar335 = local_1e0._0_4_ + fVar335;
    fVar230 = local_1e0._4_4_ + fVar230;
    fVar336 = local_1e0._8_4_ + fVar336;
    fVar235 = local_1e0._12_4_ + fVar235;
    fVar337 = local_1e0._16_4_ + fVar337;
    fVar338 = local_1e0._20_4_ + fVar338;
    fVar339 = local_1e0._24_4_ + fVar339;
    auVar22._4_4_ = fVar230 * fVar142;
    auVar22._0_4_ = fVar335 * fVar254;
    auVar22._8_4_ = fVar336 * fVar171;
    auVar22._12_4_ = fVar235 * fVar196;
    auVar22._16_4_ = fVar337 * fVar197;
    auVar22._20_4_ = fVar338 * fVar199;
    auVar22._24_4_ = fVar339 * fVar201;
    auVar22._28_4_ = fVar327;
    auVar27._4_4_ = fVar231 * fStack_21c;
    auVar27._0_4_ = fVar228 * local_220;
    auVar27._8_4_ = fVar233 * fStack_218;
    auVar27._12_4_ = fVar314 * fStack_214;
    auVar27._16_4_ = fVar170 * fStack_210;
    auVar27._20_4_ = fVar315 * fStack_20c;
    auVar27._24_4_ = fVar316 * fStack_208;
    auVar27._28_4_ = fStack_204;
    auVar22 = vsubps_avx(auVar22,auVar27);
    auVar28._4_4_ = auVar107._4_4_ * fVar142;
    auVar28._0_4_ = auVar107._0_4_ * fVar254;
    auVar28._8_4_ = auVar107._8_4_ * fVar171;
    auVar28._12_4_ = auVar107._12_4_ * fVar196;
    auVar28._16_4_ = auVar107._16_4_ * fVar197;
    auVar28._20_4_ = auVar107._20_4_ * fVar199;
    auVar28._24_4_ = auVar107._24_4_ * fVar201;
    auVar28._28_4_ = fVar327;
    local_620 = auVar106._0_4_;
    fStack_61c = auVar106._4_4_;
    fStack_618 = auVar106._8_4_;
    fStack_614 = auVar106._12_4_;
    fStack_610 = auVar106._16_4_;
    fStack_60c = auVar106._20_4_;
    fStack_608 = auVar106._24_4_;
    auVar29._4_4_ = fVar231 * fStack_61c;
    auVar29._0_4_ = fVar228 * local_620;
    auVar29._8_4_ = fVar233 * fStack_618;
    auVar29._12_4_ = fVar314 * fStack_614;
    auVar29._16_4_ = fVar170 * fStack_610;
    auVar29._20_4_ = fVar315 * fStack_60c;
    auVar29._24_4_ = fVar316 * fStack_608;
    auVar29._28_4_ = 0x40400000;
    auVar26 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = local_200._4_4_ * fVar142;
    auVar30._0_4_ = local_200._0_4_ * fVar254;
    auVar30._8_4_ = local_200._8_4_ * fVar171;
    auVar30._12_4_ = local_200._12_4_ * fVar196;
    auVar30._16_4_ = local_200._16_4_ * fVar197;
    auVar30._20_4_ = local_200._20_4_ * fVar199;
    auVar30._24_4_ = local_200._24_4_ * fVar201;
    auVar30._28_4_ = fVar327;
    auVar31._4_4_ = auVar108._4_4_ * fVar231;
    auVar31._0_4_ = auVar108._0_4_ * fVar228;
    auVar31._8_4_ = auVar108._8_4_ * fVar233;
    auVar31._12_4_ = auVar108._12_4_ * fVar314;
    auVar31._16_4_ = auVar108._16_4_ * fVar170;
    auVar31._20_4_ = auVar108._20_4_ * fVar315;
    auVar31._24_4_ = auVar108._24_4_ * fVar316;
    auVar31._28_4_ = local_200._28_4_;
    auVar27 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = auVar301._4_4_ * fVar142;
    auVar32._0_4_ = auVar301._0_4_ * fVar254;
    auVar32._8_4_ = auVar301._8_4_ * fVar171;
    auVar32._12_4_ = auVar301._12_4_ * fVar196;
    auVar32._16_4_ = auVar301._16_4_ * fVar197;
    auVar32._20_4_ = auVar301._20_4_ * fVar199;
    auVar32._24_4_ = auVar301._24_4_ * fVar201;
    auVar32._28_4_ = fVar327;
    auVar33._4_4_ = fVar231 * auVar281._4_4_;
    auVar33._0_4_ = fVar228 * auVar281._0_4_;
    auVar33._8_4_ = fVar233 * auVar281._8_4_;
    auVar33._12_4_ = fVar314 * auVar281._12_4_;
    auVar33._16_4_ = fVar170 * auVar281._16_4_;
    auVar33._20_4_ = fVar315 * auVar281._20_4_;
    auVar33._24_4_ = fVar316 * auVar281._24_4_;
    auVar33._28_4_ = auVar107._28_4_;
    auVar28 = vsubps_avx(auVar32,auVar33);
    local_240 = auVar281._0_4_ + local_240;
    fStack_23c = auVar281._4_4_ + fStack_23c;
    fStack_238 = auVar281._8_4_ + fStack_238;
    fStack_234 = auVar281._12_4_ + fStack_234;
    fStack_230 = auVar281._16_4_ + fStack_230;
    fStack_22c = auVar281._20_4_ + fStack_22c;
    fStack_228 = auVar281._24_4_ + fStack_228;
    fStack_224 = auVar281._28_4_ + auVar265._28_4_;
    local_260 = auVar301._0_4_ + local_260;
    fStack_25c = auVar301._4_4_ + fStack_25c;
    fStack_258 = auVar301._8_4_ + fStack_258;
    fStack_254 = auVar301._12_4_ + fStack_254;
    fStack_250 = auVar301._16_4_ + (float)local_680._0_4_;
    fStack_24c = auVar301._20_4_ + (float)local_680._4_4_;
    fStack_248 = auVar301._24_4_ + fStack_678;
    fStack_244 = auVar301._28_4_ + fStack_674;
    auVar34._4_4_ = fStack_25c * fVar142;
    auVar34._0_4_ = local_260 * fVar254;
    auVar34._8_4_ = fStack_258 * fVar171;
    auVar34._12_4_ = fStack_254 * fVar196;
    auVar34._16_4_ = fStack_250 * fVar197;
    auVar34._20_4_ = fStack_24c * fVar199;
    auVar34._24_4_ = fStack_248 * fVar201;
    auVar34._28_4_ = auVar301._28_4_ + fStack_674;
    auVar35._4_4_ = fStack_23c * fVar231;
    auVar35._0_4_ = local_240 * fVar228;
    auVar35._8_4_ = fStack_238 * fVar233;
    auVar35._12_4_ = fStack_234 * fVar314;
    auVar35._16_4_ = fStack_230 * fVar170;
    auVar35._20_4_ = fStack_22c * fVar315;
    auVar35._24_4_ = fStack_228 * fVar316;
    auVar35._28_4_ = fStack_224;
    auVar29 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar20._4_4_ * fVar142;
    auVar36._0_4_ = auVar20._0_4_ * fVar254;
    auVar36._8_4_ = auVar20._8_4_ * fVar171;
    auVar36._12_4_ = auVar20._12_4_ * fVar196;
    auVar36._16_4_ = auVar20._16_4_ * fVar197;
    auVar36._20_4_ = auVar20._20_4_ * fVar199;
    auVar36._24_4_ = auVar20._24_4_ * fVar201;
    auVar36._28_4_ = fStack_224;
    auVar37._4_4_ = fVar231 * auVar19._4_4_;
    auVar37._0_4_ = fVar228 * auVar19._0_4_;
    auVar37._8_4_ = fVar233 * auVar19._8_4_;
    auVar37._12_4_ = fVar314 * auVar19._12_4_;
    auVar37._16_4_ = fVar170 * auVar19._16_4_;
    auVar37._20_4_ = fVar315 * auVar19._20_4_;
    auVar37._24_4_ = fVar316 * auVar19._24_4_;
    auVar37._28_4_ = auVar19._28_4_;
    auVar30 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = auVar192._4_4_ * fVar142;
    auVar38._0_4_ = auVar192._0_4_ * fVar254;
    auVar38._8_4_ = auVar192._8_4_ * fVar171;
    auVar38._12_4_ = auVar192._12_4_ * fVar196;
    auVar38._16_4_ = auVar192._16_4_ * fVar197;
    auVar38._20_4_ = auVar192._20_4_ * fVar199;
    auVar38._24_4_ = auVar192._24_4_ * fVar201;
    auVar38._28_4_ = auVar25._28_4_ + auVar24._28_4_;
    auVar25._4_4_ = auVar109._4_4_ * fVar231;
    auVar25._0_4_ = auVar109._0_4_ * fVar228;
    auVar25._8_4_ = auVar109._8_4_ * fVar233;
    auVar25._12_4_ = auVar109._12_4_ * fVar314;
    auVar25._16_4_ = auVar109._16_4_ * fVar170;
    auVar25._20_4_ = auVar109._20_4_ * fVar315;
    auVar25._24_4_ = auVar109._24_4_ * fVar316;
    auVar25._28_4_ = fVar327 + auVar226._28_4_;
    auVar25 = vsubps_avx(auVar38,auVar25);
    auVar23 = vminps_avx(auVar21,auVar22);
    auVar106 = vmaxps_avx(auVar21,auVar22);
    auVar21 = vminps_avx(auVar26,auVar27);
    auVar21 = vminps_avx(auVar23,auVar21);
    auVar23 = vmaxps_avx(auVar26,auVar27);
    auVar106 = vmaxps_avx(auVar106,auVar23);
    auVar22 = vminps_avx(auVar28,auVar29);
    auVar23 = vmaxps_avx(auVar28,auVar29);
    auVar24 = vminps_avx(auVar30,auVar25);
    auVar22 = vminps_avx(auVar22,auVar24);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar21 = vmaxps_avx(auVar30,auVar25);
    auVar23 = vmaxps_avx(auVar23,auVar21);
    auVar23 = vmaxps_avx(auVar106,auVar23);
    auVar106 = vcmpps_avx(auVar22,local_280,2);
    auVar23 = vcmpps_avx(auVar23,local_2a0,5);
    auVar106 = vandps_avx(auVar23,auVar106);
    auVar23 = local_320 & auVar106;
    uVar78 = 0;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar23 = vsubps_avx(auVar108,local_1c0);
      auVar21 = vsubps_avx(auVar109,auVar281);
      fVar142 = auVar23._0_4_ + auVar21._0_4_;
      fVar171 = auVar23._4_4_ + auVar21._4_4_;
      fVar196 = auVar23._8_4_ + auVar21._8_4_;
      fVar197 = auVar23._12_4_ + auVar21._12_4_;
      fVar199 = auVar23._16_4_ + auVar21._16_4_;
      fVar201 = auVar23._20_4_ + auVar21._20_4_;
      fVar228 = auVar23._24_4_ + auVar21._24_4_;
      auVar22 = vsubps_avx(local_200,local_1e0);
      auVar24 = vsubps_avx(auVar192,auVar301);
      fVar231 = auVar22._0_4_ + auVar24._0_4_;
      fVar233 = auVar22._4_4_ + auVar24._4_4_;
      fVar314 = auVar22._8_4_ + auVar24._8_4_;
      fVar170 = auVar22._12_4_ + auVar24._12_4_;
      fVar315 = auVar22._16_4_ + auVar24._16_4_;
      fVar316 = auVar22._20_4_ + auVar24._20_4_;
      fVar327 = auVar22._24_4_ + auVar24._24_4_;
      fVar254 = auVar24._28_4_;
      auVar39._4_4_ = local_1e0._4_4_ * fVar171;
      auVar39._0_4_ = local_1e0._0_4_ * fVar142;
      auVar39._8_4_ = local_1e0._8_4_ * fVar196;
      auVar39._12_4_ = local_1e0._12_4_ * fVar197;
      auVar39._16_4_ = local_1e0._16_4_ * fVar199;
      auVar39._20_4_ = local_1e0._20_4_ * fVar201;
      auVar39._24_4_ = local_1e0._24_4_ * fVar228;
      auVar39._28_4_ = local_1e0._28_4_;
      auVar40._4_4_ = local_1c0._4_4_ * fVar233;
      auVar40._0_4_ = local_1c0._0_4_ * fVar231;
      auVar40._8_4_ = local_1c0._8_4_ * fVar314;
      auVar40._12_4_ = local_1c0._12_4_ * fVar170;
      auVar40._16_4_ = local_1c0._16_4_ * fVar315;
      auVar40._20_4_ = local_1c0._20_4_ * fVar316;
      auVar40._24_4_ = local_1c0._24_4_ * fVar327;
      auVar40._28_4_ = local_1c0._28_4_;
      auVar24 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar230 * fVar171;
      auVar41._0_4_ = fVar335 * fVar142;
      auVar41._8_4_ = fVar336 * fVar196;
      auVar41._12_4_ = fVar235 * fVar197;
      auVar41._16_4_ = fVar337 * fVar199;
      auVar41._20_4_ = fVar338 * fVar201;
      auVar41._24_4_ = fVar339 * fVar228;
      auVar41._28_4_ = local_1e0._28_4_;
      auVar42._4_4_ = fVar233 * fStack_21c;
      auVar42._0_4_ = fVar231 * local_220;
      auVar42._8_4_ = fVar314 * fStack_218;
      auVar42._12_4_ = fVar170 * fStack_214;
      auVar42._16_4_ = fVar315 * fStack_210;
      auVar42._20_4_ = fVar316 * fStack_20c;
      auVar42._24_4_ = fVar327 * fStack_208;
      auVar42._28_4_ = fVar254;
      auVar25 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar171 * auVar107._4_4_;
      auVar43._0_4_ = fVar142 * auVar107._0_4_;
      auVar43._8_4_ = fVar196 * auVar107._8_4_;
      auVar43._12_4_ = fVar197 * auVar107._12_4_;
      auVar43._16_4_ = fVar199 * auVar107._16_4_;
      auVar43._20_4_ = fVar201 * auVar107._20_4_;
      auVar43._24_4_ = fVar228 * auVar107._24_4_;
      auVar43._28_4_ = fVar254;
      auVar44._4_4_ = fVar233 * fStack_61c;
      auVar44._0_4_ = fVar231 * local_620;
      auVar44._8_4_ = fVar314 * fStack_618;
      auVar44._12_4_ = fVar170 * fStack_614;
      auVar44._16_4_ = fVar315 * fStack_610;
      auVar44._20_4_ = fVar316 * fStack_60c;
      auVar44._24_4_ = fVar327 * fStack_608;
      auVar44._28_4_ = local_1e0._28_4_ + auVar225._28_4_;
      auVar107 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = local_200._4_4_ * fVar171;
      auVar45._0_4_ = local_200._0_4_ * fVar142;
      auVar45._8_4_ = local_200._8_4_ * fVar196;
      auVar45._12_4_ = local_200._12_4_ * fVar197;
      auVar45._16_4_ = local_200._16_4_ * fVar199;
      auVar45._20_4_ = local_200._20_4_ * fVar201;
      auVar45._24_4_ = local_200._24_4_ * fVar228;
      auVar45._28_4_ = local_1e0._28_4_ + auVar225._28_4_;
      auVar46._4_4_ = auVar108._4_4_ * fVar233;
      auVar46._0_4_ = auVar108._0_4_ * fVar231;
      auVar46._8_4_ = auVar108._8_4_ * fVar314;
      auVar46._12_4_ = auVar108._12_4_ * fVar170;
      auVar46._16_4_ = auVar108._16_4_ * fVar315;
      auVar46._20_4_ = auVar108._20_4_ * fVar316;
      uVar6 = auVar108._28_4_;
      auVar46._24_4_ = auVar108._24_4_ * fVar327;
      auVar46._28_4_ = uVar6;
      auVar108 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = auVar301._4_4_ * fVar171;
      auVar47._0_4_ = auVar301._0_4_ * fVar142;
      auVar47._8_4_ = auVar301._8_4_ * fVar196;
      auVar47._12_4_ = auVar301._12_4_ * fVar197;
      auVar47._16_4_ = auVar301._16_4_ * fVar199;
      auVar47._20_4_ = auVar301._20_4_ * fVar201;
      auVar47._24_4_ = auVar301._24_4_ * fVar228;
      auVar47._28_4_ = auVar301._28_4_;
      auVar48._4_4_ = auVar281._4_4_ * fVar233;
      auVar48._0_4_ = auVar281._0_4_ * fVar231;
      auVar48._8_4_ = auVar281._8_4_ * fVar314;
      auVar48._12_4_ = auVar281._12_4_ * fVar170;
      auVar48._16_4_ = auVar281._16_4_ * fVar315;
      auVar48._20_4_ = auVar281._20_4_ * fVar316;
      auVar48._24_4_ = auVar281._24_4_ * fVar327;
      auVar48._28_4_ = auVar281._28_4_;
      auVar226 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar171 * fStack_25c;
      auVar49._0_4_ = fVar142 * local_260;
      auVar49._8_4_ = fVar196 * fStack_258;
      auVar49._12_4_ = fVar197 * fStack_254;
      auVar49._16_4_ = fVar199 * fStack_250;
      auVar49._20_4_ = fVar201 * fStack_24c;
      auVar49._24_4_ = fVar228 * fStack_248;
      auVar49._28_4_ = auVar301._28_4_;
      auVar50._4_4_ = fVar233 * fStack_23c;
      auVar50._0_4_ = fVar231 * local_240;
      auVar50._8_4_ = fVar314 * fStack_238;
      auVar50._12_4_ = fVar170 * fStack_234;
      auVar50._16_4_ = fVar315 * fStack_230;
      auVar50._20_4_ = fVar316 * fStack_22c;
      auVar50._24_4_ = fVar327 * fStack_228;
      auVar50._28_4_ = uVar6;
      auVar26 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar171 * auVar20._4_4_;
      auVar51._0_4_ = fVar142 * auVar20._0_4_;
      auVar51._8_4_ = fVar196 * auVar20._8_4_;
      auVar51._12_4_ = fVar197 * auVar20._12_4_;
      auVar51._16_4_ = fVar199 * auVar20._16_4_;
      auVar51._20_4_ = fVar201 * auVar20._20_4_;
      auVar51._24_4_ = fVar228 * auVar20._24_4_;
      auVar51._28_4_ = uVar6;
      auVar52._4_4_ = fVar233 * auVar19._4_4_;
      auVar52._0_4_ = fVar231 * auVar19._0_4_;
      auVar52._8_4_ = fVar314 * auVar19._8_4_;
      auVar52._12_4_ = fVar170 * auVar19._12_4_;
      auVar52._16_4_ = fVar315 * auVar19._16_4_;
      auVar52._20_4_ = fVar316 * auVar19._20_4_;
      auVar52._24_4_ = fVar327 * auVar19._24_4_;
      auVar52._28_4_ = local_200._28_4_;
      auVar19 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = auVar192._4_4_ * fVar171;
      auVar53._0_4_ = auVar192._0_4_ * fVar142;
      auVar53._8_4_ = auVar192._8_4_ * fVar196;
      auVar53._12_4_ = auVar192._12_4_ * fVar197;
      auVar53._16_4_ = auVar192._16_4_ * fVar199;
      auVar53._20_4_ = auVar192._20_4_ * fVar201;
      auVar53._24_4_ = auVar192._24_4_ * fVar228;
      auVar53._28_4_ = auVar23._28_4_ + auVar21._28_4_;
      auVar54._4_4_ = auVar109._4_4_ * fVar233;
      auVar54._0_4_ = auVar109._0_4_ * fVar231;
      auVar54._8_4_ = auVar109._8_4_ * fVar314;
      auVar54._12_4_ = auVar109._12_4_ * fVar170;
      auVar54._16_4_ = auVar109._16_4_ * fVar315;
      auVar54._20_4_ = auVar109._20_4_ * fVar316;
      auVar54._24_4_ = auVar109._24_4_ * fVar327;
      auVar54._28_4_ = auVar22._28_4_ + fVar254;
      auVar109 = vsubps_avx(auVar53,auVar54);
      auVar21 = vminps_avx(auVar24,auVar25);
      auVar23 = vmaxps_avx(auVar24,auVar25);
      auVar22 = vminps_avx(auVar107,auVar108);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar107,auVar108);
      auVar23 = vmaxps_avx(auVar23,auVar21);
      auVar24 = vminps_avx(auVar226,auVar26);
      auVar21 = vmaxps_avx(auVar226,auVar26);
      auVar107 = vminps_avx(auVar19,auVar109);
      auVar24 = vminps_avx(auVar24,auVar107);
      auVar24 = vminps_avx(auVar22,auVar24);
      auVar22 = vmaxps_avx(auVar19,auVar109);
      auVar21 = vmaxps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar23,auVar21);
      auVar23 = vcmpps_avx(auVar24,local_280,2);
      auVar21 = vcmpps_avx(auVar21,local_2a0,5);
      auVar23 = vandps_avx(auVar21,auVar23);
      auVar106 = vandps_avx(auVar106,local_320);
      auVar21 = auVar106 & auVar23;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar106 = vandps_avx(auVar23,auVar106);
        uVar78 = vmovmskps_avx(auVar106);
      }
    }
    if (uVar78 != 0) {
      auStack_470[uVar83] = uVar78;
      uVar7 = vmovlps_avx(local_3e0);
      *(undefined8 *)(afStack_300 + uVar83 * 2) = uVar7;
      uVar8 = vmovlps_avx(_local_6b0);
      auStack_1a0[uVar83] = uVar8;
      uVar83 = (ulong)((int)uVar83 + 1);
    }
    auVar381 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar83 == 0) {
        if (bVar76) {
          return local_6f1;
        }
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar105._4_4_ = uVar6;
        auVar105._0_4_ = uVar6;
        auVar105._8_4_ = uVar6;
        auVar105._12_4_ = uVar6;
        auVar129 = vcmpps_avx(local_3f0,auVar105,2);
        uVar85 = vmovmskps_avx(auVar129);
        uVar77 = uVar77 & local_508 & uVar85;
        local_6f1 = uVar77 != 0;
        if (!local_6f1) {
          return local_6f1;
        }
        goto LAB_010342ce;
      }
      uVar81 = (int)uVar83 - 1;
      uVar84 = (ulong)uVar81;
      uVar78 = auStack_470[uVar84];
      fVar254 = afStack_300[uVar84 * 2];
      fVar142 = afStack_300[uVar84 * 2 + 1];
      register0x00001588 = 0;
      local_6b0 = (undefined1  [8])auStack_1a0[uVar84];
      uVar8 = 0;
      if (uVar78 != 0) {
        for (; (uVar78 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar78 = uVar78 - 1 & uVar78;
      auStack_470[uVar84] = uVar78;
      if (uVar78 == 0) {
        uVar83 = (ulong)uVar81;
      }
      auVar241._8_4_ = 0x3f800000;
      auVar241._0_8_ = &DAT_3f8000003f800000;
      auVar241._12_4_ = 0x3f800000;
      fVar196 = (float)(uVar8 + 1) * 0.14285715;
      fVar171 = (1.0 - (float)uVar8 * 0.14285715) * fVar254 + fVar142 * (float)uVar8 * 0.14285715;
      fVar254 = (1.0 - fVar196) * fVar254 + fVar142 * fVar196;
      fVar142 = fVar254 - fVar171;
      if (0.16666667 <= fVar142) break;
      auVar129 = vshufps_avx(_local_6b0,_local_6b0,0x50);
      auVar289 = vsubps_avx(auVar241,auVar129);
      fVar196 = auVar129._0_4_;
      fVar197 = auVar129._4_4_;
      fVar199 = auVar129._8_4_;
      fVar201 = auVar129._12_4_;
      fVar228 = auVar289._0_4_;
      fVar231 = auVar289._4_4_;
      fVar233 = auVar289._8_4_;
      fVar314 = auVar289._12_4_;
      auVar181._0_4_ = auVar291._0_4_ * fVar196 + fVar228 * (float)local_5b0._0_4_;
      auVar181._4_4_ = auVar291._4_4_ * fVar197 + fVar231 * (float)local_5b0._4_4_;
      auVar181._8_4_ = auVar291._0_4_ * fVar199 + fVar233 * (float)local_5b0._0_4_;
      auVar181._12_4_ = auVar291._4_4_ * fVar201 + fVar314 * (float)local_5b0._4_4_;
      auVar218._0_4_ = auVar304._0_4_ * fVar196 + fVar228 * (float)local_480._0_4_;
      auVar218._4_4_ = auVar304._4_4_ * fVar197 + fVar231 * (float)local_480._4_4_;
      auVar218._8_4_ = auVar304._0_4_ * fVar199 + fVar233 * fStack_478;
      auVar218._12_4_ = auVar304._4_4_ * fVar201 + fVar314 * fStack_474;
      auVar242._0_4_ = auVar321._0_4_ * fVar196 + fVar228 * auVar347._0_4_;
      auVar242._4_4_ = auVar321._4_4_ * fVar197 + fVar231 * auVar347._4_4_;
      auVar242._8_4_ = auVar321._0_4_ * fVar199 + fVar233 * auVar347._0_4_;
      auVar242._12_4_ = auVar321._4_4_ * fVar201 + fVar314 * auVar347._4_4_;
      auVar125._0_4_ = auVar101._0_4_ * fVar196 + auVar123._0_4_ * fVar228;
      auVar125._4_4_ = auVar101._4_4_ * fVar197 + auVar123._4_4_ * fVar231;
      auVar125._8_4_ = auVar101._0_4_ * fVar199 + auVar123._0_4_ * fVar233;
      auVar125._12_4_ = auVar101._4_4_ * fVar201 + auVar123._4_4_ * fVar314;
      auVar164._16_16_ = auVar181;
      auVar164._0_16_ = auVar181;
      auVar193._16_16_ = auVar218;
      auVar193._0_16_ = auVar218;
      auVar227._16_16_ = auVar242;
      auVar227._0_16_ = auVar242;
      auVar106 = vshufps_avx(ZEXT2032(CONCAT416(fVar254,ZEXT416((uint)fVar171))),
                             ZEXT2032(CONCAT416(fVar254,ZEXT416((uint)fVar171))),0);
      auVar23 = vsubps_avx(auVar193,auVar164);
      fVar196 = auVar106._0_4_;
      fVar197 = auVar106._4_4_;
      fVar199 = auVar106._8_4_;
      fVar201 = auVar106._12_4_;
      fVar228 = auVar106._16_4_;
      fVar231 = auVar106._20_4_;
      fVar233 = auVar106._24_4_;
      auVar165._0_4_ = auVar181._0_4_ + auVar23._0_4_ * fVar196;
      auVar165._4_4_ = auVar181._4_4_ + auVar23._4_4_ * fVar197;
      auVar165._8_4_ = auVar181._8_4_ + auVar23._8_4_ * fVar199;
      auVar165._12_4_ = auVar181._12_4_ + auVar23._12_4_ * fVar201;
      auVar165._16_4_ = auVar181._0_4_ + auVar23._16_4_ * fVar228;
      auVar165._20_4_ = auVar181._4_4_ + auVar23._20_4_ * fVar231;
      auVar165._24_4_ = auVar181._8_4_ + auVar23._24_4_ * fVar233;
      auVar165._28_4_ = auVar181._12_4_ + auVar23._28_4_;
      auVar23 = vsubps_avx(auVar227,auVar193);
      auVar194._0_4_ = auVar218._0_4_ + auVar23._0_4_ * fVar196;
      auVar194._4_4_ = auVar218._4_4_ + auVar23._4_4_ * fVar197;
      auVar194._8_4_ = auVar218._8_4_ + auVar23._8_4_ * fVar199;
      auVar194._12_4_ = auVar218._12_4_ + auVar23._12_4_ * fVar201;
      auVar194._16_4_ = auVar218._0_4_ + auVar23._16_4_ * fVar228;
      auVar194._20_4_ = auVar218._4_4_ + auVar23._20_4_ * fVar231;
      auVar194._24_4_ = auVar218._8_4_ + auVar23._24_4_ * fVar233;
      auVar194._28_4_ = auVar218._12_4_ + auVar23._28_4_;
      auVar129 = vsubps_avx(auVar125,auVar242);
      auVar138._0_4_ = auVar242._0_4_ + auVar129._0_4_ * fVar196;
      auVar138._4_4_ = auVar242._4_4_ + auVar129._4_4_ * fVar197;
      auVar138._8_4_ = auVar242._8_4_ + auVar129._8_4_ * fVar199;
      auVar138._12_4_ = auVar242._12_4_ + auVar129._12_4_ * fVar201;
      auVar138._16_4_ = auVar242._0_4_ + auVar129._0_4_ * fVar228;
      auVar138._20_4_ = auVar242._4_4_ + auVar129._4_4_ * fVar231;
      auVar138._24_4_ = auVar242._8_4_ + auVar129._8_4_ * fVar233;
      auVar138._28_4_ = auVar242._12_4_ + auVar129._12_4_;
      auVar23 = vsubps_avx(auVar194,auVar165);
      auVar166._0_4_ = auVar165._0_4_ + fVar196 * auVar23._0_4_;
      auVar166._4_4_ = auVar165._4_4_ + fVar197 * auVar23._4_4_;
      auVar166._8_4_ = auVar165._8_4_ + fVar199 * auVar23._8_4_;
      auVar166._12_4_ = auVar165._12_4_ + fVar201 * auVar23._12_4_;
      auVar166._16_4_ = auVar165._16_4_ + fVar228 * auVar23._16_4_;
      auVar166._20_4_ = auVar165._20_4_ + fVar231 * auVar23._20_4_;
      auVar166._24_4_ = auVar165._24_4_ + fVar233 * auVar23._24_4_;
      auVar166._28_4_ = auVar165._28_4_ + auVar23._28_4_;
      auVar23 = vsubps_avx(auVar138,auVar194);
      auVar139._0_4_ = auVar194._0_4_ + fVar196 * auVar23._0_4_;
      auVar139._4_4_ = auVar194._4_4_ + fVar197 * auVar23._4_4_;
      auVar139._8_4_ = auVar194._8_4_ + fVar199 * auVar23._8_4_;
      auVar139._12_4_ = auVar194._12_4_ + fVar201 * auVar23._12_4_;
      auVar139._16_4_ = auVar194._16_4_ + fVar228 * auVar23._16_4_;
      auVar139._20_4_ = auVar194._20_4_ + fVar231 * auVar23._20_4_;
      auVar139._24_4_ = auVar194._24_4_ + fVar233 * auVar23._24_4_;
      auVar139._28_4_ = auVar194._28_4_ + auVar23._28_4_;
      auVar23 = vsubps_avx(auVar139,auVar166);
      auVar182._0_4_ = auVar166._0_4_ + fVar196 * auVar23._0_4_;
      auVar182._4_4_ = auVar166._4_4_ + fVar197 * auVar23._4_4_;
      auVar182._8_4_ = auVar166._8_4_ + fVar199 * auVar23._8_4_;
      auVar182._12_4_ = auVar166._12_4_ + fVar201 * auVar23._12_4_;
      auVar195._16_4_ = auVar166._16_4_ + fVar228 * auVar23._16_4_;
      auVar195._0_16_ = auVar182;
      auVar195._20_4_ = auVar166._20_4_ + fVar231 * auVar23._20_4_;
      auVar195._24_4_ = auVar166._24_4_ + fVar233 * auVar23._24_4_;
      auVar195._28_4_ = auVar166._28_4_ + auVar194._28_4_;
      fVar196 = auVar23._4_4_ * 3.0;
      auVar157 = auVar195._16_16_;
      auVar128 = vshufps_avx(ZEXT416((uint)(fVar142 * 0.33333334)),
                             ZEXT416((uint)(fVar142 * 0.33333334)),0);
      auVar305._0_4_ = auVar182._0_4_ + auVar128._0_4_ * auVar23._0_4_ * 3.0;
      auVar305._4_4_ = auVar182._4_4_ + auVar128._4_4_ * fVar196;
      auVar305._8_4_ = auVar182._8_4_ + auVar128._8_4_ * auVar23._8_4_ * 3.0;
      auVar305._12_4_ = auVar182._12_4_ + auVar128._12_4_ * auVar23._12_4_ * 3.0;
      auVar249 = vshufpd_avx(auVar182,auVar182,3);
      auVar188 = vshufpd_avx(auVar157,auVar157,3);
      auVar129 = vsubps_avx(auVar249,auVar182);
      auVar289 = vsubps_avx(auVar188,auVar157);
      auVar126._0_4_ = auVar129._0_4_ + auVar289._0_4_;
      auVar126._4_4_ = auVar129._4_4_ + auVar289._4_4_;
      auVar126._8_4_ = auVar129._8_4_ + auVar289._8_4_;
      auVar126._12_4_ = auVar129._12_4_ + auVar289._12_4_;
      auVar129 = vmovshdup_avx(auVar182);
      auVar289 = vmovshdup_avx(auVar305);
      auVar187 = vshufps_avx(auVar126,auVar126,0);
      auVar103 = vshufps_avx(auVar126,auVar126,0x55);
      fVar231 = auVar103._0_4_;
      fVar233 = auVar103._4_4_;
      fVar314 = auVar103._8_4_;
      fVar170 = auVar103._12_4_;
      fVar197 = auVar187._0_4_;
      fVar199 = auVar187._4_4_;
      fVar201 = auVar187._8_4_;
      fVar228 = auVar187._12_4_;
      auVar292._0_4_ = fVar197 * auVar182._0_4_ + fVar231 * auVar129._0_4_;
      auVar292._4_4_ = fVar199 * auVar182._4_4_ + fVar233 * auVar129._4_4_;
      auVar292._8_4_ = fVar201 * auVar182._8_4_ + fVar314 * auVar129._8_4_;
      auVar292._12_4_ = fVar228 * auVar182._12_4_ + fVar170 * auVar129._12_4_;
      auVar306._0_4_ = auVar305._0_4_ * fVar197 + fVar231 * auVar289._0_4_;
      auVar306._4_4_ = auVar305._4_4_ * fVar199 + fVar233 * auVar289._4_4_;
      auVar306._8_4_ = auVar305._8_4_ * fVar201 + fVar314 * auVar289._8_4_;
      auVar306._12_4_ = auVar305._12_4_ * fVar228 + fVar170 * auVar289._12_4_;
      auVar289 = vshufps_avx(auVar292,auVar292,0xe8);
      auVar187 = vshufps_avx(auVar306,auVar306,0xe8);
      auVar129 = vcmpps_avx(auVar289,auVar187,1);
      uVar78 = vextractps_avx(auVar129,0);
      auVar103 = auVar306;
      if ((uVar78 & 1) == 0) {
        auVar103 = auVar292;
      }
      auVar127._0_4_ = auVar128._0_4_ * auVar23._16_4_ * 3.0;
      auVar127._4_4_ = auVar128._4_4_ * fVar196;
      auVar127._8_4_ = auVar128._8_4_ * auVar23._24_4_ * 3.0;
      auVar127._12_4_ = auVar128._12_4_ * auVar106._28_4_;
      auVar88 = vsubps_avx(auVar157,auVar127);
      auVar128 = vmovshdup_avx(auVar88);
      auVar157 = vmovshdup_avx(auVar157);
      fVar196 = auVar88._0_4_;
      fVar315 = auVar88._4_4_;
      auVar378._0_4_ = fVar197 * fVar196 + fVar231 * auVar128._0_4_;
      auVar378._4_4_ = fVar199 * fVar315 + fVar233 * auVar128._4_4_;
      auVar378._8_4_ = fVar201 * auVar88._8_4_ + fVar314 * auVar128._8_4_;
      auVar378._12_4_ = fVar228 * auVar88._12_4_ + fVar170 * auVar128._12_4_;
      auVar364._0_4_ = fVar197 * auVar195._16_4_ + fVar231 * auVar157._0_4_;
      auVar364._4_4_ = fVar199 * auVar195._20_4_ + fVar233 * auVar157._4_4_;
      auVar364._8_4_ = fVar201 * auVar195._24_4_ + fVar314 * auVar157._8_4_;
      auVar364._12_4_ = fVar228 * auVar195._28_4_ + fVar170 * auVar157._12_4_;
      auVar157 = vshufps_avx(auVar378,auVar378,0xe8);
      auVar18 = vshufps_avx(auVar364,auVar364,0xe8);
      auVar128 = vcmpps_avx(auVar157,auVar18,1);
      uVar78 = vextractps_avx(auVar128,0);
      auVar89 = auVar364;
      if ((uVar78 & 1) == 0) {
        auVar89 = auVar378;
      }
      auVar103 = vmaxss_avx(auVar89,auVar103);
      auVar289 = vminps_avx(auVar289,auVar187);
      auVar187 = vminps_avx(auVar157,auVar18);
      auVar187 = vminps_avx(auVar289,auVar187);
      auVar129 = vshufps_avx(auVar129,auVar129,0x55);
      auVar129 = vblendps_avx(auVar129,auVar128,2);
      auVar128 = vpslld_avx(auVar129,0x1f);
      auVar129 = vshufpd_avx(auVar306,auVar306,1);
      auVar129 = vinsertps_avx(auVar129,auVar364,0x9c);
      auVar289 = vshufpd_avx(auVar292,auVar292,1);
      auVar289 = vinsertps_avx(auVar289,auVar378,0x9c);
      auVar129 = vblendvps_avx(auVar289,auVar129,auVar128);
      auVar289 = vmovshdup_avx(auVar129);
      auVar129 = vmaxss_avx(auVar289,auVar129);
      fVar201 = auVar187._0_4_;
      auVar289 = vmovshdup_avx(auVar187);
      fVar199 = auVar129._0_4_;
      fVar228 = auVar289._0_4_;
      fVar197 = auVar103._0_4_;
      if ((0.0001 <= fVar201) || (fVar199 <= -0.0001)) {
        if ((-0.0001 < fVar197 && fVar228 < 0.0001) ||
           ((fVar201 < 0.0001 && -0.0001 < fVar197 || (fVar228 < 0.0001 && -0.0001 < fVar199))))
        goto LAB_01035a1c;
LAB_01036624:
        bVar55 = true;
        auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_01035a1c:
        auVar381 = ZEXT464(0) << 0x20;
        auVar128 = vcmpps_avx(auVar187,ZEXT416(0) << 0x20,1);
        auVar289 = vcmpss_avx(auVar103,ZEXT416(0),1);
        auVar372._8_4_ = 0x3f800000;
        auVar372._0_8_ = &DAT_3f8000003f800000;
        auVar372._12_4_ = 0x3f800000;
        auVar243._8_4_ = 0xbf800000;
        auVar243._0_8_ = 0xbf800000bf800000;
        auVar243._12_4_ = 0xbf800000;
        auVar289 = vblendvps_avx(auVar372,auVar243,auVar289);
        auVar128 = vblendvps_avx(auVar372,auVar243,auVar128);
        auVar157 = vcmpss_avx(auVar289,auVar128,4);
        auVar157 = vpshufd_avx(ZEXT416(auVar157._0_4_ & 1),0x50);
        auVar157 = vpslld_avx(auVar157,0x1f);
        auVar157 = vpsrad_avx(auVar157,0x1f);
        auVar157 = vpandn_avx(auVar157,_DAT_02020eb0);
        auVar18 = vmovshdup_avx(auVar128);
        fVar231 = auVar18._0_4_;
        if ((auVar128._0_4_ != fVar231) || (NAN(auVar128._0_4_) || NAN(fVar231))) {
          if ((fVar228 != fVar201) || (NAN(fVar228) || NAN(fVar201))) {
            fVar201 = -fVar201 / (fVar228 - fVar201);
            auVar128 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar201) * 0.0 + fVar201)));
          }
          else {
            auVar128 = vcmpss_avx(auVar187,ZEXT416(0),0);
            auVar128 = vpshufd_avx(ZEXT416(auVar128._0_4_ & 1),0x50);
            auVar128 = vpslld_avx(auVar128,0x1f);
            auVar128 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar128);
          }
          auVar18 = vcmpps_avx(auVar157,auVar128,1);
          auVar187 = vblendps_avx(auVar157,auVar128,2);
          auVar128 = vblendps_avx(auVar128,auVar157,2);
          auVar157 = vblendvps_avx(auVar128,auVar187,auVar18);
        }
        auVar129 = vcmpss_avx(auVar129,ZEXT416(0),1);
        auVar158._8_4_ = 0xbf800000;
        auVar158._0_8_ = 0xbf800000bf800000;
        auVar158._12_4_ = 0xbf800000;
        auVar129 = vblendvps_avx(auVar372,auVar158,auVar129);
        fVar201 = auVar129._0_4_;
        if ((auVar289._0_4_ != fVar201) || (NAN(auVar289._0_4_) || NAN(fVar201))) {
          if ((fVar199 != fVar197) || (NAN(fVar199) || NAN(fVar197))) {
            fVar197 = -fVar197 / (fVar199 - fVar197);
            auVar129 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar197) * 0.0 + fVar197)));
          }
          else {
            auVar129 = vcmpss_avx(auVar103,ZEXT416(0),0);
            auVar129 = vpshufd_avx(ZEXT416(auVar129._0_4_ & 1),0x50);
            auVar129 = vpslld_avx(auVar129,0x1f);
            auVar129 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar129);
          }
          auVar128 = vcmpps_avx(auVar157,auVar129,1);
          auVar289 = vblendps_avx(auVar157,auVar129,2);
          auVar129 = vblendps_avx(auVar129,auVar157,2);
          auVar157 = vblendvps_avx(auVar129,auVar289,auVar128);
        }
        if ((fVar231 != fVar201) || (NAN(fVar231) || NAN(fVar201))) {
          auVar129 = vcmpps_avx(auVar157,auVar372,1);
          auVar289 = vinsertps_avx(auVar157,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar244._4_12_ = auVar157._4_12_;
          auVar244._0_4_ = 0x3f800000;
          auVar157 = vblendvps_avx(auVar244,auVar289,auVar129);
        }
        auVar129 = vcmpps_avx(auVar157,_DAT_01fec6f0,1);
        auVar58._12_4_ = 0;
        auVar58._0_12_ = auVar157._4_12_;
        auVar289 = vinsertps_avx(auVar157,ZEXT416(0x3f800000),0x10);
        auVar129 = vblendvps_avx(auVar289,auVar58 << 0x20,auVar129);
        auVar289 = vmovshdup_avx(auVar129);
        bVar55 = true;
        if (auVar129._0_4_ <= auVar289._0_4_) {
          auVar130._0_4_ = auVar129._0_4_ + -0.1;
          auVar130._4_4_ = auVar129._4_4_ + 0.1;
          auVar130._8_4_ = auVar129._8_4_ + 0.0;
          auVar130._12_4_ = auVar129._12_4_ + 0.0;
          auVar128 = vshufpd_avx(auVar305,auVar305,3);
          auVar183._8_8_ = 0x3f80000000000000;
          auVar183._0_8_ = 0x3f80000000000000;
          auVar129 = vcmpps_avx(auVar130,auVar183,1);
          auVar59._12_4_ = 0;
          auVar59._0_12_ = auVar130._4_12_;
          auVar289 = vinsertps_avx(auVar130,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar129 = vblendvps_avx(auVar289,auVar59 << 0x20,auVar129);
          auVar289 = vshufpd_avx(auVar88,auVar88,3);
          auVar187 = vshufps_avx(auVar129,auVar129,0x50);
          auVar103 = vsubps_avx(auVar372,auVar187);
          local_600 = auVar249._0_4_;
          fStack_5fc = auVar249._4_4_;
          fStack_5f8 = auVar249._8_4_;
          fStack_5f4 = auVar249._12_4_;
          fVar197 = auVar187._0_4_;
          fVar199 = auVar187._4_4_;
          fVar201 = auVar187._8_4_;
          fVar228 = auVar187._12_4_;
          local_660 = auVar188._0_4_;
          fStack_65c = auVar188._4_4_;
          fStack_658 = auVar188._8_4_;
          fStack_654 = auVar188._12_4_;
          fVar231 = auVar103._0_4_;
          fVar233 = auVar103._4_4_;
          fVar314 = auVar103._8_4_;
          fVar170 = auVar103._12_4_;
          auVar159._0_4_ = fVar197 * local_600 + fVar231 * auVar182._0_4_;
          auVar159._4_4_ = fVar199 * fStack_5fc + fVar233 * auVar182._4_4_;
          auVar159._8_4_ = fVar201 * fStack_5f8 + fVar314 * auVar182._0_4_;
          auVar159._12_4_ = fVar228 * fStack_5f4 + fVar170 * auVar182._4_4_;
          auVar219._0_4_ = fVar197 * auVar128._0_4_ + fVar231 * auVar305._0_4_;
          auVar219._4_4_ = fVar199 * auVar128._4_4_ + fVar233 * auVar305._4_4_;
          auVar219._8_4_ = fVar201 * auVar128._8_4_ + fVar314 * auVar305._0_4_;
          auVar219._12_4_ = fVar228 * auVar128._12_4_ + fVar170 * auVar305._4_4_;
          auVar279._0_4_ = fVar197 * auVar289._0_4_ + fVar231 * fVar196;
          auVar279._4_4_ = fVar199 * auVar289._4_4_ + fVar233 * fVar315;
          auVar279._8_4_ = fVar201 * auVar289._8_4_ + fVar314 * fVar196;
          auVar279._12_4_ = fVar228 * auVar289._12_4_ + fVar170 * fVar315;
          auVar293._0_4_ = fVar197 * local_660 + fVar231 * auVar195._16_4_;
          auVar293._4_4_ = fVar199 * fStack_65c + fVar233 * auVar195._20_4_;
          auVar293._8_4_ = fVar201 * fStack_658 + fVar314 * auVar195._16_4_;
          auVar293._12_4_ = fVar228 * fStack_654 + fVar170 * auVar195._20_4_;
          auVar188 = vsubps_avx(auVar372,auVar129);
          auVar289 = vmovshdup_avx(_local_6b0);
          auVar249 = vmovsldup_avx(_local_6b0);
          local_6b0._0_4_ = auVar188._0_4_ * auVar249._0_4_ + auVar289._0_4_ * auVar129._0_4_;
          local_6b0._4_4_ = auVar188._4_4_ * auVar249._4_4_ + auVar289._4_4_ * auVar129._4_4_;
          fStack_6a8 = auVar188._8_4_ * auVar249._8_4_ + auVar289._8_4_ * auVar129._8_4_;
          fStack_6a4 = auVar188._12_4_ * auVar249._12_4_ + auVar289._12_4_ * auVar129._12_4_;
          auVar88 = vmovshdup_avx(_local_6b0);
          auVar129 = vsubps_avx(auVar219,auVar159);
          auVar245._0_4_ = auVar129._0_4_ * 3.0;
          auVar245._4_4_ = auVar129._4_4_ * 3.0;
          auVar245._8_4_ = auVar129._8_4_ * 3.0;
          auVar245._12_4_ = auVar129._12_4_ * 3.0;
          auVar129 = vsubps_avx(auVar279,auVar219);
          auVar261._0_4_ = auVar129._0_4_ * 3.0;
          auVar261._4_4_ = auVar129._4_4_ * 3.0;
          auVar261._8_4_ = auVar129._8_4_ * 3.0;
          auVar261._12_4_ = auVar129._12_4_ * 3.0;
          auVar129 = vsubps_avx(auVar293,auVar279);
          auVar307._0_4_ = auVar129._0_4_ * 3.0;
          auVar307._4_4_ = auVar129._4_4_ * 3.0;
          auVar307._8_4_ = auVar129._8_4_ * 3.0;
          auVar307._12_4_ = auVar129._12_4_ * 3.0;
          auVar289 = vminps_avx(auVar261,auVar307);
          auVar129 = vmaxps_avx(auVar261,auVar307);
          auVar289 = vminps_avx(auVar245,auVar289);
          auVar129 = vmaxps_avx(auVar245,auVar129);
          auVar249 = vshufpd_avx(auVar289,auVar289,3);
          auVar188 = vshufpd_avx(auVar129,auVar129,3);
          auVar289 = vminps_avx(auVar289,auVar249);
          auVar129 = vmaxps_avx(auVar129,auVar188);
          auVar249 = vshufps_avx(ZEXT416((uint)(1.0 / fVar142)),ZEXT416((uint)(1.0 / fVar142)),0);
          auVar246._0_4_ = auVar249._0_4_ * auVar289._0_4_;
          auVar246._4_4_ = auVar249._4_4_ * auVar289._4_4_;
          auVar246._8_4_ = auVar249._8_4_ * auVar289._8_4_;
          auVar246._12_4_ = auVar249._12_4_ * auVar289._12_4_;
          auVar262._0_4_ = auVar129._0_4_ * auVar249._0_4_;
          auVar262._4_4_ = auVar129._4_4_ * auVar249._4_4_;
          auVar262._8_4_ = auVar129._8_4_ * auVar249._8_4_;
          auVar262._12_4_ = auVar129._12_4_ * auVar249._12_4_;
          auVar103 = ZEXT416((uint)(1.0 / (auVar88._0_4_ - (float)local_6b0._0_4_)));
          auVar129 = vshufpd_avx(auVar159,auVar159,3);
          auVar289 = vshufpd_avx(auVar219,auVar219,3);
          auVar249 = vshufpd_avx(auVar279,auVar279,3);
          auVar188 = vshufpd_avx(auVar293,auVar293,3);
          auVar129 = vsubps_avx(auVar129,auVar159);
          auVar128 = vsubps_avx(auVar289,auVar219);
          auVar187 = vsubps_avx(auVar249,auVar279);
          auVar188 = vsubps_avx(auVar188,auVar293);
          auVar289 = vminps_avx(auVar129,auVar128);
          auVar129 = vmaxps_avx(auVar129,auVar128);
          auVar249 = vminps_avx(auVar187,auVar188);
          auVar249 = vminps_avx(auVar289,auVar249);
          auVar289 = vmaxps_avx(auVar187,auVar188);
          auVar129 = vmaxps_avx(auVar129,auVar289);
          auVar289 = vshufps_avx(auVar103,auVar103,0);
          auVar322._0_4_ = auVar289._0_4_ * auVar249._0_4_;
          auVar322._4_4_ = auVar289._4_4_ * auVar249._4_4_;
          auVar322._8_4_ = auVar289._8_4_ * auVar249._8_4_;
          auVar322._12_4_ = auVar289._12_4_ * auVar249._12_4_;
          auVar330._0_4_ = auVar289._0_4_ * auVar129._0_4_;
          auVar330._4_4_ = auVar289._4_4_ * auVar129._4_4_;
          auVar330._8_4_ = auVar289._8_4_ * auVar129._8_4_;
          auVar330._12_4_ = auVar289._12_4_ * auVar129._12_4_;
          auVar129 = vmovsldup_avx(_local_6b0);
          auVar280._4_12_ = auVar129._4_12_;
          auVar280._0_4_ = fVar171;
          auVar294._4_12_ = local_6b0._4_12_;
          auVar294._0_4_ = fVar254;
          auVar104._0_4_ = (fVar254 + fVar171) * 0.5;
          auVar104._4_4_ = ((float)local_6b0._4_4_ + auVar129._4_4_) * 0.5;
          auVar104._8_4_ = (fStack_6a8 + auVar129._8_4_) * 0.5;
          auVar104._12_4_ = (fStack_6a4 + auVar129._12_4_) * 0.5;
          auVar129 = vshufps_avx(auVar104,auVar104,0);
          fVar196 = auVar129._0_4_;
          fVar197 = auVar129._4_4_;
          fVar199 = auVar129._8_4_;
          fVar201 = auVar129._12_4_;
          local_5c0 = auVar16._0_4_;
          fStack_5bc = auVar16._4_4_;
          fStack_5b8 = auVar16._8_4_;
          fStack_5b4 = auVar16._12_4_;
          auVar220._0_4_ = fVar196 * (float)local_330._0_4_ + local_5c0;
          auVar220._4_4_ = fVar197 * (float)local_330._4_4_ + fStack_5bc;
          auVar220._8_4_ = fVar199 * fStack_328 + fStack_5b8;
          auVar220._12_4_ = fVar201 * fStack_324 + fStack_5b4;
          local_5d0 = auVar17._0_4_;
          fStack_5cc = auVar17._4_4_;
          fStack_5c8 = auVar17._8_4_;
          fStack_5c4 = auVar17._12_4_;
          auVar308._0_4_ = fVar196 * (float)local_340._0_4_ + local_5d0;
          auVar308._4_4_ = fVar197 * (float)local_340._4_4_ + fStack_5cc;
          auVar308._8_4_ = fVar199 * fStack_338 + fStack_5c8;
          auVar308._12_4_ = fVar201 * fStack_334 + fStack_5c4;
          local_5e0 = auVar208._0_4_;
          fStack_5dc = auVar208._4_4_;
          fStack_5d8 = auVar208._8_4_;
          fStack_5d4 = auVar208._12_4_;
          auVar348._0_4_ = fVar196 * (float)local_350._0_4_ + local_5e0;
          auVar348._4_4_ = fVar197 * (float)local_350._4_4_ + fStack_5dc;
          auVar348._8_4_ = fVar199 * fStack_348 + fStack_5d8;
          auVar348._12_4_ = fVar201 * fStack_344 + fStack_5d4;
          auVar129 = vsubps_avx(auVar308,auVar220);
          auVar221._0_4_ = auVar129._0_4_ * fVar196 + auVar220._0_4_;
          auVar221._4_4_ = auVar129._4_4_ * fVar197 + auVar220._4_4_;
          auVar221._8_4_ = auVar129._8_4_ * fVar199 + auVar220._8_4_;
          auVar221._12_4_ = auVar129._12_4_ * fVar201 + auVar220._12_4_;
          auVar129 = vsubps_avx(auVar348,auVar308);
          auVar309._0_4_ = auVar308._0_4_ + auVar129._0_4_ * fVar196;
          auVar309._4_4_ = auVar308._4_4_ + auVar129._4_4_ * fVar197;
          auVar309._8_4_ = auVar308._8_4_ + auVar129._8_4_ * fVar199;
          auVar309._12_4_ = auVar308._12_4_ + auVar129._12_4_ * fVar201;
          auVar129 = vsubps_avx(auVar309,auVar221);
          fVar196 = auVar221._0_4_ + auVar129._0_4_ * fVar196;
          fVar197 = auVar221._4_4_ + auVar129._4_4_ * fVar197;
          auVar160._0_8_ = CONCAT44(fVar197,fVar196);
          auVar160._8_4_ = auVar221._8_4_ + auVar129._8_4_ * fVar199;
          auVar160._12_4_ = auVar221._12_4_ + auVar129._12_4_ * fVar201;
          fVar199 = auVar129._0_4_ * 3.0;
          fVar201 = auVar129._4_4_ * 3.0;
          auVar222._0_8_ = CONCAT44(fVar201,fVar199);
          auVar222._8_4_ = auVar129._8_4_ * 3.0;
          auVar222._12_4_ = auVar129._12_4_ * 3.0;
          auVar310._8_8_ = auVar160._0_8_;
          auVar310._0_8_ = auVar160._0_8_;
          auVar129 = vshufpd_avx(auVar160,auVar160,3);
          auVar289 = vshufps_avx(auVar104,auVar104,0x55);
          auVar187 = vsubps_avx(auVar129,auVar310);
          auVar311._0_4_ = auVar289._0_4_ * auVar187._0_4_ + fVar196;
          auVar311._4_4_ = auVar289._4_4_ * auVar187._4_4_ + fVar197;
          auVar311._8_4_ = auVar289._8_4_ * auVar187._8_4_ + fVar196;
          auVar311._12_4_ = auVar289._12_4_ * auVar187._12_4_ + fVar197;
          auVar365._8_8_ = auVar222._0_8_;
          auVar365._0_8_ = auVar222._0_8_;
          auVar129 = vshufpd_avx(auVar222,auVar222,1);
          auVar129 = vsubps_avx(auVar129,auVar365);
          auVar223._0_4_ = fVar199 + auVar289._0_4_ * auVar129._0_4_;
          auVar223._4_4_ = fVar201 + auVar289._4_4_ * auVar129._4_4_;
          auVar223._8_4_ = fVar199 + auVar289._8_4_ * auVar129._8_4_;
          auVar223._12_4_ = fVar201 + auVar289._12_4_ * auVar129._12_4_;
          auVar289 = vmovshdup_avx(auVar223);
          auVar366._0_8_ = auVar289._0_8_ ^ 0x8000000080000000;
          auVar366._8_4_ = auVar289._8_4_ ^ 0x80000000;
          auVar366._12_4_ = auVar289._12_4_ ^ 0x80000000;
          auVar249 = vmovshdup_avx(auVar187);
          auVar129 = vunpcklps_avx(auVar249,auVar366);
          auVar188 = vshufps_avx(auVar129,auVar366,4);
          auVar161._0_8_ = auVar187._0_8_ ^ 0x8000000080000000;
          auVar161._8_4_ = -auVar187._8_4_;
          auVar161._12_4_ = -auVar187._12_4_;
          auVar129 = vmovlhps_avx(auVar161,auVar223);
          auVar128 = vshufps_avx(auVar129,auVar223,8);
          auVar129 = ZEXT416((uint)(auVar249._0_4_ * auVar223._0_4_ -
                                   auVar289._0_4_ * auVar187._0_4_));
          auVar289 = vshufps_avx(auVar129,auVar129,0);
          auVar129 = vdivps_avx(auVar188,auVar289);
          auVar289 = vdivps_avx(auVar128,auVar289);
          auVar128 = vinsertps_avx(auVar246,auVar322,0x1c);
          auVar187 = vinsertps_avx(auVar262,auVar330,0x1c);
          auVar103 = vinsertps_avx(auVar322,auVar246,0x4c);
          auVar157 = vinsertps_avx(auVar330,auVar262,0x4c);
          auVar249 = vmovsldup_avx(auVar129);
          auVar331._0_4_ = auVar249._0_4_ * auVar128._0_4_;
          auVar331._4_4_ = auVar249._4_4_ * auVar128._4_4_;
          auVar331._8_4_ = auVar249._8_4_ * auVar128._8_4_;
          auVar331._12_4_ = auVar249._12_4_ * auVar128._12_4_;
          auVar323._0_4_ = auVar249._0_4_ * auVar187._0_4_;
          auVar323._4_4_ = auVar249._4_4_ * auVar187._4_4_;
          auVar323._8_4_ = auVar249._8_4_ * auVar187._8_4_;
          auVar323._12_4_ = auVar249._12_4_ * auVar187._12_4_;
          auVar188 = vminps_avx(auVar331,auVar323);
          auVar249 = vmaxps_avx(auVar323,auVar331);
          auVar18 = vmovsldup_avx(auVar289);
          auVar379._0_4_ = auVar18._0_4_ * auVar103._0_4_;
          auVar379._4_4_ = auVar18._4_4_ * auVar103._4_4_;
          auVar379._8_4_ = auVar18._8_4_ * auVar103._8_4_;
          auVar379._12_4_ = auVar18._12_4_ * auVar103._12_4_;
          auVar324._0_4_ = auVar18._0_4_ * auVar157._0_4_;
          auVar324._4_4_ = auVar18._4_4_ * auVar157._4_4_;
          auVar324._8_4_ = auVar18._8_4_ * auVar157._8_4_;
          auVar324._12_4_ = auVar18._12_4_ * auVar157._12_4_;
          auVar18 = vminps_avx(auVar379,auVar324);
          auVar131._0_4_ = auVar188._0_4_ + auVar18._0_4_;
          auVar131._4_4_ = auVar188._4_4_ + auVar18._4_4_;
          auVar131._8_4_ = auVar188._8_4_ + auVar18._8_4_;
          auVar131._12_4_ = auVar188._12_4_ + auVar18._12_4_;
          auVar188 = vmaxps_avx(auVar324,auVar379);
          auVar18 = vsubps_avx(auVar280,auVar104);
          auVar89 = vsubps_avx(auVar294,auVar104);
          auVar295._0_4_ = auVar249._0_4_ + auVar188._0_4_;
          auVar295._4_4_ = auVar249._4_4_ + auVar188._4_4_;
          auVar295._8_4_ = auVar249._8_4_ + auVar188._8_4_;
          auVar295._12_4_ = auVar249._12_4_ + auVar188._12_4_;
          auVar332._8_8_ = 0x3f800000;
          auVar332._0_8_ = 0x3f800000;
          auVar249 = vsubps_avx(auVar332,auVar295);
          auVar188 = vsubps_avx(auVar332,auVar131);
          fVar233 = auVar18._0_4_;
          auVar333._0_4_ = fVar233 * auVar249._0_4_;
          fVar314 = auVar18._4_4_;
          auVar333._4_4_ = fVar314 * auVar249._4_4_;
          fVar170 = auVar18._8_4_;
          auVar333._8_4_ = fVar170 * auVar249._8_4_;
          fVar315 = auVar18._12_4_;
          auVar333._12_4_ = fVar315 * auVar249._12_4_;
          fVar199 = auVar89._0_4_;
          auVar296._0_4_ = auVar249._0_4_ * fVar199;
          fVar201 = auVar89._4_4_;
          auVar296._4_4_ = auVar249._4_4_ * fVar201;
          fVar228 = auVar89._8_4_;
          auVar296._8_4_ = auVar249._8_4_ * fVar228;
          fVar231 = auVar89._12_4_;
          auVar296._12_4_ = auVar249._12_4_ * fVar231;
          auVar373._0_4_ = fVar233 * auVar188._0_4_;
          auVar373._4_4_ = fVar314 * auVar188._4_4_;
          auVar373._8_4_ = fVar170 * auVar188._8_4_;
          auVar373._12_4_ = fVar315 * auVar188._12_4_;
          auVar132._0_4_ = fVar199 * auVar188._0_4_;
          auVar132._4_4_ = fVar201 * auVar188._4_4_;
          auVar132._8_4_ = fVar228 * auVar188._8_4_;
          auVar132._12_4_ = fVar231 * auVar188._12_4_;
          auVar249 = vminps_avx(auVar333,auVar373);
          auVar188 = vminps_avx(auVar296,auVar132);
          auVar18 = vminps_avx(auVar249,auVar188);
          auVar249 = vmaxps_avx(auVar373,auVar333);
          auVar188 = vmaxps_avx(auVar132,auVar296);
          auVar89 = vshufps_avx(auVar104,auVar104,0x54);
          auVar188 = vmaxps_avx(auVar188,auVar249);
          auVar90 = vshufps_avx(auVar311,auVar311,0);
          auVar115 = vshufps_avx(auVar311,auVar311,0x55);
          auVar249 = vhaddps_avx(auVar18,auVar18);
          auVar188 = vhaddps_avx(auVar188,auVar188);
          auVar297._0_4_ = auVar90._0_4_ * auVar129._0_4_ + auVar115._0_4_ * auVar289._0_4_;
          auVar297._4_4_ = auVar90._4_4_ * auVar129._4_4_ + auVar115._4_4_ * auVar289._4_4_;
          auVar297._8_4_ = auVar90._8_4_ * auVar129._8_4_ + auVar115._8_4_ * auVar289._8_4_;
          auVar297._12_4_ = auVar90._12_4_ * auVar129._12_4_ + auVar115._12_4_ * auVar289._12_4_;
          auVar18 = vsubps_avx(auVar89,auVar297);
          fVar196 = auVar18._0_4_ + auVar249._0_4_;
          fVar197 = auVar18._0_4_ + auVar188._0_4_;
          auVar249 = vmaxss_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar196));
          auVar188 = vminss_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar254));
          if (auVar249._0_4_ <= auVar188._0_4_) {
            auVar249 = vmovshdup_avx(auVar129);
            auVar184._0_4_ = auVar128._0_4_ * auVar249._0_4_;
            auVar184._4_4_ = auVar128._4_4_ * auVar249._4_4_;
            auVar184._8_4_ = auVar128._8_4_ * auVar249._8_4_;
            auVar184._12_4_ = auVar128._12_4_ * auVar249._12_4_;
            auVar133._0_4_ = auVar187._0_4_ * auVar249._0_4_;
            auVar133._4_4_ = auVar187._4_4_ * auVar249._4_4_;
            auVar133._8_4_ = auVar187._8_4_ * auVar249._8_4_;
            auVar133._12_4_ = auVar187._12_4_ * auVar249._12_4_;
            auVar188 = vminps_avx(auVar184,auVar133);
            auVar249 = vmaxps_avx(auVar133,auVar184);
            auVar128 = vmovshdup_avx(auVar289);
            auVar247._0_4_ = auVar128._0_4_ * auVar103._0_4_;
            auVar247._4_4_ = auVar128._4_4_ * auVar103._4_4_;
            auVar247._8_4_ = auVar128._8_4_ * auVar103._8_4_;
            auVar247._12_4_ = auVar128._12_4_ * auVar103._12_4_;
            auVar185._0_4_ = auVar128._0_4_ * auVar157._0_4_;
            auVar185._4_4_ = auVar128._4_4_ * auVar157._4_4_;
            auVar185._8_4_ = auVar128._8_4_ * auVar157._8_4_;
            auVar185._12_4_ = auVar128._12_4_ * auVar157._12_4_;
            auVar128 = vminps_avx(auVar247,auVar185);
            auVar263._0_4_ = auVar188._0_4_ + auVar128._0_4_;
            auVar263._4_4_ = auVar188._4_4_ + auVar128._4_4_;
            auVar263._8_4_ = auVar188._8_4_ + auVar128._8_4_;
            auVar263._12_4_ = auVar188._12_4_ + auVar128._12_4_;
            auVar188 = vmaxps_avx(auVar185,auVar247);
            auVar134._0_4_ = auVar249._0_4_ + auVar188._0_4_;
            auVar134._4_4_ = auVar249._4_4_ + auVar188._4_4_;
            auVar134._8_4_ = auVar249._8_4_ + auVar188._8_4_;
            auVar134._12_4_ = auVar249._12_4_ + auVar188._12_4_;
            auVar249 = vsubps_avx(auVar183,auVar134);
            auVar188 = vsubps_avx(auVar183,auVar263);
            auVar248._0_4_ = fVar233 * auVar249._0_4_;
            auVar248._4_4_ = fVar314 * auVar249._4_4_;
            auVar248._8_4_ = fVar170 * auVar249._8_4_;
            auVar248._12_4_ = fVar315 * auVar249._12_4_;
            auVar264._0_4_ = fVar233 * auVar188._0_4_;
            auVar264._4_4_ = fVar314 * auVar188._4_4_;
            auVar264._8_4_ = fVar170 * auVar188._8_4_;
            auVar264._12_4_ = fVar315 * auVar188._12_4_;
            auVar135._0_4_ = fVar199 * auVar249._0_4_;
            auVar135._4_4_ = fVar201 * auVar249._4_4_;
            auVar135._8_4_ = fVar228 * auVar249._8_4_;
            auVar135._12_4_ = fVar231 * auVar249._12_4_;
            auVar186._0_4_ = fVar199 * auVar188._0_4_;
            auVar186._4_4_ = fVar201 * auVar188._4_4_;
            auVar186._8_4_ = fVar228 * auVar188._8_4_;
            auVar186._12_4_ = fVar231 * auVar188._12_4_;
            auVar249 = vminps_avx(auVar248,auVar264);
            auVar188 = vminps_avx(auVar135,auVar186);
            auVar249 = vminps_avx(auVar249,auVar188);
            auVar188 = vmaxps_avx(auVar264,auVar248);
            auVar128 = vmaxps_avx(auVar186,auVar135);
            auVar249 = vhaddps_avx(auVar249,auVar249);
            auVar188 = vmaxps_avx(auVar128,auVar188);
            auVar188 = vhaddps_avx(auVar188,auVar188);
            auVar128 = vmovshdup_avx(auVar18);
            auVar187 = ZEXT416((uint)(auVar128._0_4_ + auVar249._0_4_));
            auVar249 = vmaxss_avx(_local_6b0,auVar187);
            auVar128 = ZEXT416((uint)(auVar128._0_4_ + auVar188._0_4_));
            auVar188 = vminss_avx(auVar128,auVar88);
            auVar374._8_4_ = 0x7fffffff;
            auVar374._0_8_ = 0x7fffffff7fffffff;
            auVar374._12_4_ = 0x7fffffff;
            if (auVar249._0_4_ <= auVar188._0_4_) {
              uVar78 = 0;
              auVar381 = ZEXT864(0) << 0x20;
              if ((fVar171 < fVar196) && (fVar197 < fVar254)) {
                auVar249 = vcmpps_avx(auVar128,auVar88,1);
                auVar188 = vcmpps_avx(_local_6b0,auVar187,1);
                auVar249 = vandps_avx(auVar188,auVar249);
                uVar78 = auVar249._0_4_;
              }
              if (((uint)uVar83 < 4 && 0.001 <= fVar142) && (uVar78 & 1) == 0) {
                bVar55 = false;
              }
              else {
                lVar80 = 200;
                do {
                  fVar196 = auVar18._0_4_;
                  fVar142 = 1.0 - fVar196;
                  auVar249 = ZEXT416((uint)(fVar142 * fVar142 * fVar142));
                  auVar249 = vshufps_avx(auVar249,auVar249,0);
                  auVar188 = ZEXT416((uint)(fVar196 * 3.0 * fVar142 * fVar142));
                  auVar188 = vshufps_avx(auVar188,auVar188,0);
                  auVar128 = ZEXT416((uint)(fVar142 * fVar196 * fVar196 * 3.0));
                  auVar128 = vshufps_avx(auVar128,auVar128,0);
                  auVar187 = ZEXT416((uint)(fVar196 * fVar196 * fVar196));
                  auVar187 = vshufps_avx(auVar187,auVar187,0);
                  fVar142 = local_5c0 * auVar249._0_4_ +
                            local_5d0 * auVar188._0_4_ +
                            (float)local_490._0_4_ * auVar187._0_4_ + local_5e0 * auVar128._0_4_;
                  fVar196 = fStack_5bc * auVar249._4_4_ +
                            fStack_5cc * auVar188._4_4_ +
                            (float)local_490._4_4_ * auVar187._4_4_ + fStack_5dc * auVar128._4_4_;
                  auVar136._0_8_ = CONCAT44(fVar196,fVar142);
                  auVar136._8_4_ =
                       fStack_5b8 * auVar249._8_4_ +
                       fStack_5c8 * auVar188._8_4_ +
                       fStack_488 * auVar187._8_4_ + fStack_5d8 * auVar128._8_4_;
                  auVar136._12_4_ =
                       fStack_5b4 * auVar249._12_4_ +
                       fStack_5c4 * auVar188._12_4_ +
                       fStack_484 * auVar187._12_4_ + fStack_5d4 * auVar128._12_4_;
                  auVar189._8_8_ = auVar136._0_8_;
                  auVar189._0_8_ = auVar136._0_8_;
                  auVar188 = vshufpd_avx(auVar136,auVar136,1);
                  auVar249 = vmovshdup_avx(auVar18);
                  auVar188 = vsubps_avx(auVar188,auVar189);
                  auVar137._0_4_ = auVar249._0_4_ * auVar188._0_4_ + fVar142;
                  auVar137._4_4_ = auVar249._4_4_ * auVar188._4_4_ + fVar196;
                  auVar137._8_4_ = auVar249._8_4_ * auVar188._8_4_ + fVar142;
                  auVar137._12_4_ = auVar249._12_4_ * auVar188._12_4_ + fVar196;
                  auVar249 = vshufps_avx(auVar137,auVar137,0);
                  auVar188 = vshufps_avx(auVar137,auVar137,0x55);
                  auVar190._0_4_ = auVar129._0_4_ * auVar249._0_4_ + auVar289._0_4_ * auVar188._0_4_
                  ;
                  auVar190._4_4_ = auVar129._4_4_ * auVar249._4_4_ + auVar289._4_4_ * auVar188._4_4_
                  ;
                  auVar190._8_4_ = auVar129._8_4_ * auVar249._8_4_ + auVar289._8_4_ * auVar188._8_4_
                  ;
                  auVar190._12_4_ =
                       auVar129._12_4_ * auVar249._12_4_ + auVar289._12_4_ * auVar188._12_4_;
                  auVar18 = vsubps_avx(auVar18,auVar190);
                  auVar249 = vandps_avx(auVar374,auVar137);
                  auVar188 = vshufps_avx(auVar249,auVar249,0xf5);
                  auVar249 = vmaxss_avx(auVar188,auVar249);
                  if (auVar249._0_4_ < fVar141) {
                    fVar142 = auVar18._0_4_;
                    if ((0.0 <= fVar142) && (fVar142 <= 1.0)) {
                      auVar129 = vmovshdup_avx(auVar18);
                      fVar196 = auVar129._0_4_;
                      if ((0.0 <= fVar196) && (fVar196 <= 1.0)) {
                        auVar129 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar157 = vinsertps_avx(auVar129,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar129 = vdpps_avx(auVar157,local_360,0x7f);
                        auVar289 = vdpps_avx(auVar157,local_370,0x7f);
                        auVar249 = vdpps_avx(auVar157,local_3a0,0x7f);
                        auVar188 = vdpps_avx(auVar157,local_3b0,0x7f);
                        auVar128 = vdpps_avx(auVar157,local_3c0,0x7f);
                        auVar187 = vdpps_avx(auVar157,local_3d0,0x7f);
                        fVar231 = 1.0 - fVar196;
                        auVar103 = vdpps_avx(auVar157,local_380,0x7f);
                        auVar157 = vdpps_avx(auVar157,local_390,0x7f);
                        fVar233 = 1.0 - fVar142;
                        fVar197 = auVar18._4_4_;
                        fVar199 = auVar18._8_4_;
                        fVar201 = auVar18._12_4_;
                        fVar228 = fVar233 * fVar142 * fVar142 * 3.0;
                        auVar250._0_4_ = fVar142 * fVar142 * fVar142;
                        auVar250._4_4_ = fVar197 * fVar197 * fVar197;
                        auVar250._8_4_ = fVar199 * fVar199 * fVar199;
                        auVar250._12_4_ = fVar201 * fVar201 * fVar201;
                        fVar197 = fVar142 * 3.0 * fVar233 * fVar233;
                        fVar199 = fVar233 * fVar233 * fVar233;
                        fVar142 = (fVar231 * auVar129._0_4_ + fVar196 * auVar249._0_4_) * fVar199 +
                                  (fVar231 * auVar289._0_4_ + fVar196 * auVar188._0_4_) * fVar197 +
                                  fVar228 * (fVar231 * auVar103._0_4_ + fVar196 * auVar128._0_4_) +
                                  auVar250._0_4_ *
                                  (auVar187._0_4_ * fVar196 + fVar231 * auVar157._0_4_);
                        if ((fVar114 <= fVar142) &&
                           (fVar196 = *(float *)(ray + k * 4 + 0x100), fVar142 <= fVar196)) {
                          pGVar10 = (context->scene->geometries).items[uVar85].ptr;
                          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                            bVar87 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar87 = true,
                                  pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_f0 = vshufps_avx(auVar18,auVar18,0x55);
                            auVar298._8_4_ = 0x3f800000;
                            auVar298._0_8_ = &DAT_3f8000003f800000;
                            auVar298._12_4_ = 0x3f800000;
                            auVar129 = vsubps_avx(auVar298,local_f0);
                            fVar201 = local_f0._0_4_;
                            fVar231 = local_f0._4_4_;
                            fVar314 = local_f0._8_4_;
                            fVar170 = local_f0._12_4_;
                            fVar315 = auVar129._0_4_;
                            fVar316 = auVar129._4_4_;
                            fVar327 = auVar129._8_4_;
                            fVar302 = auVar129._12_4_;
                            auVar312._0_4_ =
                                 fVar201 * (float)local_4d0._0_4_ + fVar315 * (float)local_4a0._0_4_
                            ;
                            auVar312._4_4_ =
                                 fVar231 * (float)local_4d0._4_4_ + fVar316 * (float)local_4a0._4_4_
                            ;
                            auVar312._8_4_ = fVar314 * fStack_4c8 + fVar327 * fStack_498;
                            auVar312._12_4_ = fVar170 * fStack_4c4 + fVar302 * fStack_494;
                            auVar325._0_4_ = fVar201 * fVar251 + fVar315 * fVar236;
                            auVar325._4_4_ = fVar231 * fVar198 + fVar316 * fVar253;
                            auVar325._8_4_ = fVar314 * fVar229 + fVar327 * fVar202;
                            auVar325._12_4_ = fVar170 * fVar112 + fVar302 * fVar234;
                            auVar334._0_4_ = fVar201 * fVar252 + fVar315 * (float)local_4b0._0_4_;
                            auVar334._4_4_ = fVar231 * fVar200 + fVar316 * (float)local_4b0._4_4_;
                            auVar334._8_4_ = fVar314 * fVar232 + fVar327 * fStack_4a8;
                            auVar334._12_4_ = fVar170 * fVar113 + fVar302 * fStack_4a4;
                            auVar299._0_4_ =
                                 fVar201 * (float)local_4e0._0_4_ + fVar315 * (float)local_4c0._0_4_
                            ;
                            auVar299._4_4_ =
                                 fVar231 * (float)local_4e0._4_4_ + fVar316 * (float)local_4c0._4_4_
                            ;
                            auVar299._8_4_ = fVar314 * fStack_4d8 + fVar327 * fStack_4b8;
                            auVar299._12_4_ = fVar170 * fStack_4d4 + fVar302 * fStack_4b4;
                            auVar188 = vsubps_avx(auVar325,auVar312);
                            auVar128 = vsubps_avx(auVar334,auVar325);
                            auVar187 = vsubps_avx(auVar299,auVar334);
                            local_110 = vshufps_avx(auVar18,auVar18,0);
                            fVar201 = local_110._0_4_;
                            fVar314 = local_110._4_4_;
                            fVar170 = local_110._8_4_;
                            fVar316 = local_110._12_4_;
                            auVar129 = vshufps_avx(ZEXT416((uint)fVar233),ZEXT416((uint)fVar233),0);
                            fVar231 = auVar129._0_4_;
                            fVar233 = auVar129._4_4_;
                            fVar315 = auVar129._8_4_;
                            fVar327 = auVar129._12_4_;
                            auVar129 = vshufps_avx(auVar250,auVar250,0);
                            auVar289 = vshufps_avx(ZEXT416((uint)fVar228),ZEXT416((uint)fVar228),0);
                            auVar249 = vshufps_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),0);
                            auVar224._0_4_ =
                                 ((auVar128._0_4_ * fVar231 + auVar187._0_4_ * fVar201) * fVar201 +
                                 (auVar188._0_4_ * fVar231 + auVar128._0_4_ * fVar201) * fVar231) *
                                 3.0;
                            auVar224._4_4_ =
                                 ((auVar128._4_4_ * fVar233 + auVar187._4_4_ * fVar314) * fVar314 +
                                 (auVar188._4_4_ * fVar233 + auVar128._4_4_ * fVar314) * fVar233) *
                                 3.0;
                            auVar224._8_4_ =
                                 ((auVar128._8_4_ * fVar315 + auVar187._8_4_ * fVar170) * fVar170 +
                                 (auVar188._8_4_ * fVar315 + auVar128._8_4_ * fVar170) * fVar315) *
                                 3.0;
                            auVar224._12_4_ =
                                 ((auVar128._12_4_ * fVar327 + auVar187._12_4_ * fVar316) * fVar316
                                 + (auVar188._12_4_ * fVar327 + auVar128._12_4_ * fVar316) * fVar327
                                 ) * 3.0;
                            auVar188 = vshufps_avx(ZEXT416((uint)fVar199),ZEXT416((uint)fVar199),0);
                            auVar162._0_4_ =
                                 auVar188._0_4_ * (float)local_400._0_4_ +
                                 auVar249._0_4_ * (float)local_410._0_4_ +
                                 auVar129._0_4_ * (float)local_430._0_4_ +
                                 auVar289._0_4_ * (float)local_420._0_4_;
                            auVar162._4_4_ =
                                 auVar188._4_4_ * (float)local_400._4_4_ +
                                 auVar249._4_4_ * (float)local_410._4_4_ +
                                 auVar129._4_4_ * (float)local_430._4_4_ +
                                 auVar289._4_4_ * (float)local_420._4_4_;
                            auVar162._8_4_ =
                                 auVar188._8_4_ * fStack_3f8 +
                                 auVar249._8_4_ * fStack_408 +
                                 auVar129._8_4_ * fStack_428 + auVar289._8_4_ * fStack_418;
                            auVar162._12_4_ =
                                 auVar188._12_4_ * fStack_3f4 +
                                 auVar249._12_4_ * fStack_404 +
                                 auVar129._12_4_ * fStack_424 + auVar289._12_4_ * fStack_414;
                            auVar129 = vshufps_avx(auVar224,auVar224,0xc9);
                            auVar191._0_4_ = auVar162._0_4_ * auVar129._0_4_;
                            auVar191._4_4_ = auVar162._4_4_ * auVar129._4_4_;
                            auVar191._8_4_ = auVar162._8_4_ * auVar129._8_4_;
                            auVar191._12_4_ = auVar162._12_4_ * auVar129._12_4_;
                            auVar129 = vshufps_avx(auVar162,auVar162,0xc9);
                            auVar163._0_4_ = auVar224._0_4_ * auVar129._0_4_;
                            auVar163._4_4_ = auVar224._4_4_ * auVar129._4_4_;
                            auVar163._8_4_ = auVar224._8_4_ * auVar129._8_4_;
                            auVar163._12_4_ = auVar224._12_4_ * auVar129._12_4_;
                            auVar129 = vsubps_avx(auVar163,auVar191);
                            local_170 = vshufps_avx(auVar129,auVar129,0x55);
                            local_180[0] = (RTCHitN)local_170[0];
                            local_180[1] = (RTCHitN)local_170[1];
                            local_180[2] = (RTCHitN)local_170[2];
                            local_180[3] = (RTCHitN)local_170[3];
                            local_180[4] = (RTCHitN)local_170[4];
                            local_180[5] = (RTCHitN)local_170[5];
                            local_180[6] = (RTCHitN)local_170[6];
                            local_180[7] = (RTCHitN)local_170[7];
                            local_180[8] = (RTCHitN)local_170[8];
                            local_180[9] = (RTCHitN)local_170[9];
                            local_180[10] = (RTCHitN)local_170[10];
                            local_180[0xb] = (RTCHitN)local_170[0xb];
                            local_180[0xc] = (RTCHitN)local_170[0xc];
                            local_180[0xd] = (RTCHitN)local_170[0xd];
                            local_180[0xe] = (RTCHitN)local_170[0xe];
                            local_180[0xf] = (RTCHitN)local_170[0xf];
                            local_150 = vshufps_avx(auVar129,auVar129,0xaa);
                            local_160 = local_150;
                            local_130 = vshufps_avx(auVar129,auVar129,0);
                            local_140 = local_130;
                            local_120 = local_110;
                            local_100 = local_f0;
                            local_e0 = local_2e0._0_8_;
                            uStack_d8 = local_2e0._8_8_;
                            uStack_d0 = local_2e0._16_8_;
                            uStack_c8 = local_2e0._24_8_;
                            local_c0 = local_2c0._0_8_;
                            uStack_b8 = local_2c0._8_8_;
                            uStack_b0 = local_2c0._16_8_;
                            uStack_a8 = local_2c0._24_8_;
                            auVar106 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_84 = auVar106._28_4_;
                            uVar78 = uStack_84;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar142;
                            local_4f0 = *(undefined8 *)(mm_lookupmask_ps + lVar82);
                            uStack_4e8 = *(undefined8 *)(mm_lookupmask_ps + lVar82 + 8);
                            local_500 = *(undefined8 *)(mm_lookupmask_ps + uVar79);
                            uStack_4f8 = *(undefined8 *)(mm_lookupmask_ps + uVar79 + 8);
                            local_460.valid = (int *)&local_500;
                            local_460.geometryUserPtr = pGVar10->userPtr;
                            local_460.context = context->user;
                            local_460.ray = (RTCRayN *)ray;
                            local_460.hit = local_180;
                            local_460.N = 8;
                            if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar10->occlusionFilterN)(&local_460);
                              auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar71._8_8_ = uStack_4f8;
                            auVar71._0_8_ = local_500;
                            auVar129 = vpcmpeqd_avx(auVar381._0_16_,auVar71);
                            auVar73._8_8_ = uStack_4e8;
                            auVar73._0_8_ = local_4f0;
                            auVar289 = vpcmpeqd_avx(auVar381._0_16_,auVar73);
                            auVar110._16_16_ = auVar289;
                            auVar110._0_16_ = auVar129;
                            auVar23 = auVar106 & ~auVar110;
                            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar23 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar23 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar23 >> 0x7f,0) == '\0') &&
                                  (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar23 >> 0xbf,0) == '\0') &&
                                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar23[0x1f]) {
                              auVar111._0_4_ = auVar129._0_4_ ^ auVar106._0_4_;
                              auVar111._4_4_ = auVar129._4_4_ ^ auVar106._4_4_;
                              auVar111._8_4_ = auVar129._8_4_ ^ auVar106._8_4_;
                              auVar111._12_4_ = auVar129._12_4_ ^ auVar106._12_4_;
                              auVar111._16_4_ = auVar289._0_4_ ^ auVar106._16_4_;
                              auVar111._20_4_ = auVar289._4_4_ ^ auVar106._20_4_;
                              auVar111._24_4_ = auVar289._8_4_ ^ auVar106._24_4_;
                              auVar111._28_4_ = auVar289._12_4_ ^ uVar78;
                            }
                            else {
                              p_Var15 = context->args->filter;
                              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var15)(&local_460);
                                auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar72._8_8_ = uStack_4f8;
                              auVar72._0_8_ = local_500;
                              auVar129 = vpcmpeqd_avx(auVar381._0_16_,auVar72);
                              auVar74._8_8_ = uStack_4e8;
                              auVar74._0_8_ = local_4f0;
                              auVar289 = vpcmpeqd_avx(auVar381._0_16_,auVar74);
                              auVar140._16_16_ = auVar289;
                              auVar140._0_16_ = auVar129;
                              auVar111._0_4_ = auVar129._0_4_ ^ auVar106._0_4_;
                              auVar111._4_4_ = auVar129._4_4_ ^ auVar106._4_4_;
                              auVar111._8_4_ = auVar129._8_4_ ^ auVar106._8_4_;
                              auVar111._12_4_ = auVar129._12_4_ ^ auVar106._12_4_;
                              auVar111._16_4_ = auVar289._0_4_ ^ auVar106._16_4_;
                              auVar111._20_4_ = auVar289._4_4_ ^ auVar106._20_4_;
                              auVar111._24_4_ = auVar289._8_4_ ^ auVar106._24_4_;
                              auVar111._28_4_ = auVar289._12_4_ ^ uVar78;
                              auVar167._8_4_ = 0xff800000;
                              auVar167._0_8_ = 0xff800000ff800000;
                              auVar167._12_4_ = 0xff800000;
                              auVar167._16_4_ = 0xff800000;
                              auVar167._20_4_ = 0xff800000;
                              auVar167._24_4_ = 0xff800000;
                              auVar167._28_4_ = 0xff800000;
                              auVar106 = vblendvps_avx(auVar167,*(undefined1 (*) [32])
                                                                 (local_460.ray + 0x100),auVar140);
                              *(undefined1 (*) [32])(local_460.ray + 0x100) = auVar106;
                            }
                            bVar63 = (auVar111 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar64 = (auVar111 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar62 = (auVar111 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar61 = SUB321(auVar111 >> 0x7f,0) != '\0';
                            bVar60 = (auVar111 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar57 = SUB321(auVar111 >> 0xbf,0) != '\0';
                            bVar56 = (auVar111 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar87 = auVar111[0x1f] < '\0';
                            if (((((((!bVar63 && !bVar64) && !bVar62) && !bVar61) && !bVar60) &&
                                 !bVar57) && !bVar56) && !bVar87) {
                              *(float *)(ray + k * 4 + 0x100) = fVar196;
                            }
                            bVar87 = ((((((bVar63 || bVar64) || bVar62) || bVar61) || bVar60) ||
                                      bVar57) || bVar56) || bVar87;
                          }
                          bVar76 = (bool)(bVar76 | bVar87);
                        }
                      }
                    }
                    break;
                  }
                  lVar80 = lVar80 + -1;
                } while (lVar80 != 0);
              }
              goto LAB_010362a8;
            }
          }
          goto LAB_01036624;
        }
      }
LAB_010362a8:
    } while (bVar55);
    local_3e0 = vinsertps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar254),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }